

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  bool bVar54;
  undefined1 auVar55 [12];
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  int iVar88;
  uint uVar89;
  ulong uVar90;
  uint uVar91;
  ulong uVar92;
  byte unaff_BL;
  long lVar93;
  uint uVar94;
  undefined4 uVar95;
  ulong uVar96;
  ulong uVar97;
  float fVar98;
  float fVar128;
  float fVar130;
  vint4 bi_2;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar114 [32];
  float fVar99;
  undefined1 auVar115 [32];
  float fVar129;
  float fVar131;
  float fVar132;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar127 [64];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  float fVar164;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  float fVar188;
  vint4 ai_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar208;
  float fVar222;
  float fVar224;
  vint4 ai;
  float fVar226;
  undefined1 auVar216 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar223;
  float fVar225;
  float fVar227;
  undefined1 auVar217 [32];
  undefined1 auVar215 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar209 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  vint4 bi;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar251;
  undefined1 auVar245 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar249 [32];
  float fVar252;
  undefined1 auVar250 [64];
  vint4 ai_1;
  float fVar272;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar281;
  undefined1 auVar279 [32];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar262;
  float fVar263;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar264;
  float fVar270;
  float fVar271;
  undefined1 auVar265 [16];
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar269 [64];
  undefined1 auVar276 [16];
  undefined1 auVar280 [64];
  undefined1 auVar282 [16];
  undefined1 auVar286 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar287 [64];
  float fVar288;
  float fVar289;
  float fVar297;
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [28];
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar306 [32];
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  float P_err;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_c89;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  Primitive *local_978;
  Primitive *local_970;
  ulong local_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  ulong local_780;
  undefined1 auStack_778 [24];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  uint uStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_01 [56];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar283 [16];
  undefined1 auVar296 [64];
  
  PVar2 = prim[1];
  uVar97 = (ulong)(byte)PVar2;
  lVar93 = uVar97 * 0x19;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar98 = *(float *)(prim + lVar93 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + lVar93 + 6));
  auVar100._0_4_ = fVar98 * auVar5._0_4_;
  auVar100._4_4_ = fVar98 * auVar5._4_4_;
  auVar100._8_4_ = fVar98 * auVar5._8_4_;
  auVar100._12_4_ = fVar98 * auVar5._12_4_;
  auVar228._0_4_ = fVar98 * auVar6._0_4_;
  auVar228._4_4_ = fVar98 * auVar6._4_4_;
  auVar228._8_4_ = fVar98 * auVar6._8_4_;
  auVar228._12_4_ = fVar98 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar97 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar97 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar96 = (ulong)(uint)((int)(uVar97 * 9) * 2);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + uVar97 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  uVar96 = (ulong)(uint)((int)(uVar97 * 5) << 2);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar303._4_4_ = auVar228._0_4_;
  auVar303._0_4_ = auVar228._0_4_;
  auVar303._8_4_ = auVar228._0_4_;
  auVar303._12_4_ = auVar228._0_4_;
  auVar137 = vshufps_avx(auVar228,auVar228,0x55);
  auVar101 = vshufps_avx(auVar228,auVar228,0xaa);
  fVar98 = auVar101._0_4_;
  auVar282._0_4_ = fVar98 * auVar7._0_4_;
  fVar128 = auVar101._4_4_;
  auVar282._4_4_ = fVar128 * auVar7._4_4_;
  fVar130 = auVar101._8_4_;
  auVar282._8_4_ = fVar130 * auVar7._8_4_;
  fVar288 = auVar101._12_4_;
  auVar282._12_4_ = fVar288 * auVar7._12_4_;
  auVar276._0_4_ = auVar10._0_4_ * fVar98;
  auVar276._4_4_ = auVar10._4_4_ * fVar128;
  auVar276._8_4_ = auVar10._8_4_ * fVar130;
  auVar276._12_4_ = auVar10._12_4_ * fVar288;
  auVar253._0_4_ = auVar109._0_4_ * fVar98;
  auVar253._4_4_ = auVar109._4_4_ * fVar128;
  auVar253._8_4_ = auVar109._8_4_ * fVar130;
  auVar253._12_4_ = auVar109._12_4_ * fVar288;
  auVar101 = vfmadd231ps_fma(auVar282,auVar137,auVar6);
  auVar138 = vfmadd231ps_fma(auVar276,auVar137,auVar9);
  auVar137 = vfmadd231ps_fma(auVar253,auVar102,auVar137);
  auVar189 = vfmadd231ps_fma(auVar101,auVar303,auVar5);
  auVar138 = vfmadd231ps_fma(auVar138,auVar303,auVar8);
  auVar145 = vfmadd231ps_fma(auVar137,auVar103,auVar303);
  auVar304._4_4_ = auVar100._0_4_;
  auVar304._0_4_ = auVar100._0_4_;
  auVar304._8_4_ = auVar100._0_4_;
  auVar304._12_4_ = auVar100._0_4_;
  auVar137 = vshufps_avx(auVar100,auVar100,0x55);
  auVar101 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar98 = auVar101._0_4_;
  auVar229._0_4_ = fVar98 * auVar7._0_4_;
  fVar128 = auVar101._4_4_;
  auVar229._4_4_ = fVar128 * auVar7._4_4_;
  fVar130 = auVar101._8_4_;
  auVar229._8_4_ = fVar130 * auVar7._8_4_;
  fVar288 = auVar101._12_4_;
  auVar229._12_4_ = fVar288 * auVar7._12_4_;
  auVar136._0_4_ = auVar10._0_4_ * fVar98;
  auVar136._4_4_ = auVar10._4_4_ * fVar128;
  auVar136._8_4_ = auVar10._8_4_ * fVar130;
  auVar136._12_4_ = auVar10._12_4_ * fVar288;
  auVar101._0_4_ = auVar109._0_4_ * fVar98;
  auVar101._4_4_ = auVar109._4_4_ * fVar128;
  auVar101._8_4_ = auVar109._8_4_ * fVar130;
  auVar101._12_4_ = auVar109._12_4_ * fVar288;
  auVar6 = vfmadd231ps_fma(auVar229,auVar137,auVar6);
  auVar7 = vfmadd231ps_fma(auVar136,auVar137,auVar9);
  auVar9 = vfmadd231ps_fma(auVar101,auVar137,auVar102);
  auVar10 = vfmadd231ps_fma(auVar6,auVar304,auVar5);
  auVar102 = vfmadd231ps_fma(auVar7,auVar304,auVar8);
  auVar109 = vfmadd231ps_fma(auVar9,auVar304,auVar103);
  auVar243._8_4_ = 0x7fffffff;
  auVar243._0_8_ = 0x7fffffff7fffffff;
  auVar243._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar189,auVar243);
  auVar209._8_4_ = 0x219392ef;
  auVar209._0_8_ = 0x219392ef219392ef;
  auVar209._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar209,1);
  auVar6 = vblendvps_avx(auVar189,auVar209,auVar5);
  auVar5 = vandps_avx(auVar138,auVar243);
  auVar5 = vcmpps_avx(auVar5,auVar209,1);
  auVar7 = vblendvps_avx(auVar138,auVar209,auVar5);
  auVar5 = vandps_avx(auVar145,auVar243);
  auVar5 = vcmpps_avx(auVar5,auVar209,1);
  auVar5 = vblendvps_avx(auVar145,auVar209,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar244._8_4_ = 0x3f800000;
  auVar244._0_8_ = &DAT_3f8000003f800000;
  auVar244._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar244);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar244);
  auVar9 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar7 = vfnmadd213ps_fma(auVar5,auVar6,auVar244);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar97 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar103 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar145._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar145._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar145._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar145._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar97 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar230._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar230._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar230._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar230._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar138._1_3_ = 0;
  auVar138[0] = PVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar97 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar102);
  auVar254._0_4_ = auVar5._0_4_ * auVar9._0_4_;
  auVar254._4_4_ = auVar5._4_4_ * auVar9._4_4_;
  auVar254._8_4_ = auVar5._8_4_ * auVar9._8_4_;
  auVar254._12_4_ = auVar5._12_4_ * auVar9._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar102);
  auVar137._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar137._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar137._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar137._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar96 + uVar97 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar109);
  auVar189._0_4_ = auVar103._0_4_ * auVar5._0_4_;
  auVar189._4_4_ = auVar103._4_4_ * auVar5._4_4_;
  auVar189._8_4_ = auVar103._8_4_ * auVar5._8_4_;
  auVar189._12_4_ = auVar103._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar97 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar109);
  auVar102._0_4_ = auVar103._0_4_ * auVar5._0_4_;
  auVar102._4_4_ = auVar103._4_4_ * auVar5._4_4_;
  auVar102._8_4_ = auVar103._8_4_ * auVar5._8_4_;
  auVar102._12_4_ = auVar103._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar145,auVar230);
  auVar6 = vpminsd_avx(auVar254,auVar137);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar189,auVar102);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar265._4_4_ = uVar95;
  auVar265._0_4_ = uVar95;
  auVar265._8_4_ = uVar95;
  auVar265._12_4_ = uVar95;
  auVar6 = vmaxps_avx(auVar6,auVar265);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_630._0_4_ = auVar5._0_4_ * 0.99999964;
  local_630._4_4_ = auVar5._4_4_ * 0.99999964;
  local_630._8_4_ = auVar5._8_4_ * 0.99999964;
  local_630._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar145,auVar230);
  auVar6 = vpmaxsd_avx(auVar254,auVar137);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar189,auVar102);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar109._4_4_ = uVar95;
  auVar109._0_4_ = uVar95;
  auVar109._8_4_ = uVar95;
  auVar109._12_4_ = uVar95;
  auVar6 = vminps_avx(auVar6,auVar109);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar103._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar103._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar103._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar103._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar138[4] = PVar2;
  auVar138._5_3_ = 0;
  auVar138[8] = PVar2;
  auVar138._9_3_ = 0;
  auVar138[0xc] = PVar2;
  auVar138._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar138,_DAT_01ff0cf0);
  auVar5 = vcmpps_avx(local_630,auVar103,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar91 = vmovmskps_avx(auVar5);
  local_c89 = uVar91 != 0;
  if (uVar91 == 0) {
    return local_c89;
  }
  uVar91 = uVar91 & 0xff;
  local_978 = prim + lVar93 + 0x16;
  auVar218._16_16_ = mm_lookupmask_ps._240_16_;
  auVar218._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar218,ZEXT832(0) << 0x20,0x80);
  iVar88 = 1 << ((uint)k & 0x1f);
  auVar114._4_4_ = iVar88;
  auVar114._0_4_ = iVar88;
  auVar114._8_4_ = iVar88;
  auVar114._12_4_ = iVar88;
  auVar114._16_4_ = iVar88;
  auVar114._20_4_ = iVar88;
  auVar114._24_4_ = iVar88;
  auVar114._28_4_ = iVar88;
  auVar237 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar218 = vpand_avx2(auVar114,auVar237);
  local_620 = vpcmpeqd_avx2(auVar218,auVar237);
  local_900 = 0x7fffffff;
  uStack_8fc = 0x7fffffff;
  uStack_8f8 = 0x7fffffff;
  uStack_8f4 = 0x7fffffff;
  uStack_8f0 = 0x7fffffff;
  uStack_8ec = 0x7fffffff;
  uStack_8e8 = 0x7fffffff;
  uStack_8e4 = 0x7fffffff;
  local_760 = 0x80000000;
  uStack_75c = 0x80000000;
  uStack_758 = 0x80000000;
  uStack_754 = 0x80000000;
  fStack_750 = -0.0;
  fStack_74c = -0.0;
  fStack_748 = -0.0;
  uStack_744 = 0x80000000;
  local_970 = prim;
LAB_0166ad63:
  lVar93 = 0;
  local_968 = (ulong)uVar91;
  for (uVar97 = local_968; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
    lVar93 = lVar93 + 1;
  }
  local_968 = local_968 - 1 & local_968;
  local_600 = *(undefined4 *)(local_970 + lVar93 * 4 + 6);
  uVar97 = (ulong)(uint)((int)lVar93 << 6);
  auVar5 = *(undefined1 (*) [16])(local_978 + uVar97);
  if (local_968 != 0) {
    uVar92 = local_968 - 1 & local_968;
    for (uVar96 = local_968; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
    }
    if (uVar92 != 0) {
      for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_978 + uVar97 + 0x10);
  auVar7 = *(undefined1 (*) [16])(local_978 + uVar97 + 0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar10 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar98 = *(float *)(ray + k * 4 + 0x80);
  auVar277._4_4_ = fVar98;
  auVar277._0_4_ = fVar98;
  auVar277._8_4_ = fVar98;
  auVar277._12_4_ = fVar98;
  auVar278._16_4_ = fVar98;
  auVar278._0_16_ = auVar277;
  auVar278._20_4_ = fVar98;
  auVar278._24_4_ = fVar98;
  auVar278._28_4_ = fVar98;
  auVar280 = ZEXT3264(auVar278);
  auVar8 = *(undefined1 (*) [16])(local_978 + uVar97 + 0x30);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar283._4_4_ = uVar95;
  auVar283._0_4_ = uVar95;
  auVar283._8_4_ = uVar95;
  auVar283._12_4_ = uVar95;
  fStack_8d0 = (float)uVar95;
  _local_8e0 = auVar283;
  fStack_8cc = (float)uVar95;
  fStack_8c8 = (float)uVar95;
  register0x000014dc = uVar95;
  auVar287 = ZEXT3264(_local_8e0);
  auVar9 = vunpcklps_avx(auVar277,auVar283);
  fVar128 = *(float *)(ray + k * 4 + 0xc0);
  auVar290._4_4_ = fVar128;
  auVar290._0_4_ = fVar128;
  auVar290._8_4_ = fVar128;
  auVar290._12_4_ = fVar128;
  fStack_a50 = fVar128;
  _local_a60 = auVar290;
  fStack_a4c = fVar128;
  fStack_a48 = fVar128;
  register0x0000151c = fVar128;
  auVar296 = ZEXT3264(_local_a60);
  local_a10 = vinsertps_avx(auVar9,auVar290,0x28);
  auVar231._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_) * 0.25;
  auVar231._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_ + auVar8._4_4_) * 0.25;
  auVar231._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_ + auVar8._8_4_) * 0.25;
  auVar231._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_ + auVar8._12_4_) * 0.25;
  auVar9 = vsubps_avx(auVar231,auVar10);
  auVar9 = vdpps_avx(auVar9,local_a10,0x7f);
  local_a20 = vdpps_avx(local_a10,local_a10,0x7f);
  auVar269 = ZEXT1664(local_a20);
  uVar91 = *(uint *)(local_970 + 2);
  auVar103 = vrcpss_avx(local_a20,local_a20);
  auVar102 = vfnmadd213ss_fma(auVar103,local_a20,ZEXT416(0x40000000));
  auVar250 = ZEXT1664(auVar102);
  fVar130 = auVar9._0_4_ * auVar103._0_4_ * auVar102._0_4_;
  auVar239._4_4_ = fVar130;
  auVar239._0_4_ = fVar130;
  auVar239._8_4_ = fVar130;
  auVar239._12_4_ = fVar130;
  auVar9 = vfmadd231ps_fma(auVar10,local_a10,auVar239);
  auVar9 = vblendps_avx(auVar9,_DAT_01feba10,8);
  auVar10 = vsubps_avx(auVar5,auVar9);
  auVar7 = vsubps_avx(auVar7,auVar9);
  auVar103 = vsubps_avx(auVar6,auVar9);
  auVar8 = vsubps_avx(auVar8,auVar9);
  auVar5 = vmovshdup_avx(auVar10);
  local_1a0 = auVar5._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar5 = vshufps_avx(auVar10,auVar10,0xaa);
  local_1c0 = auVar5._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vmovshdup_avx(auVar103);
  local_480 = auVar5._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar5 = vshufps_avx(auVar103,auVar103,0xaa);
  local_4a0 = auVar5._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar5 = vshufps_avx(auVar103,auVar103,0xff);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vmovshdup_avx(auVar7);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(auVar7,auVar7,0xaa);
  local_4c0 = auVar5._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar5 = vshufps_avx(auVar7,auVar7,0xff);
  local_4e0 = auVar5._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar5 = vmovshdup_avx(auVar8);
  local_500 = auVar5._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_520 = auVar5._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_540 = auVar5._0_8_;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar128 * fVar128)),_local_8e0,_local_8e0);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar278,auVar278);
  uVar95 = auVar5._0_4_;
  local_240._4_4_ = uVar95;
  local_240._0_4_ = uVar95;
  local_240._8_4_ = uVar95;
  local_240._12_4_ = uVar95;
  local_240._16_4_ = uVar95;
  local_240._20_4_ = uVar95;
  local_240._24_4_ = uVar95;
  local_240._28_4_ = uVar95;
  auVar221 = ZEXT3264(local_240);
  fVar128 = *(float *)(ray + k * 4 + 0x60);
  local_9a0 = ZEXT416((uint)fVar130);
  local_2a0 = fVar128 - fVar130;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  local_5e0 = uVar91;
  uStack_5dc = uVar91;
  uStack_5d8 = uVar91;
  uStack_5d4 = uVar91;
  uStack_5d0 = uVar91;
  uStack_5cc = uVar91;
  uStack_5c8 = uVar91;
  uStack_5c4 = uVar91;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uVar97 = 1;
  uVar92 = 0;
  local_560 = auVar10._0_4_;
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  local_260 = auVar103._0_4_;
  uStack_25c = local_260;
  uStack_258 = local_260;
  uStack_254 = local_260;
  uStack_250 = local_260;
  uStack_24c = local_260;
  uStack_248 = local_260;
  uStack_244 = local_260;
  local_580 = auVar7._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  fVar188 = auVar8._0_4_;
  auVar237._4_4_ = uStack_8fc;
  auVar237._0_4_ = local_900;
  auVar237._8_4_ = uStack_8f8;
  auVar237._12_4_ = uStack_8f4;
  auVar237._16_4_ = uStack_8f0;
  auVar237._20_4_ = uStack_8ec;
  auVar237._24_4_ = uStack_8e8;
  auVar237._28_4_ = uStack_8e4;
  local_5c0 = vandps_avx(local_240,auVar237);
  auVar5 = vsqrtss_avx(local_a20,local_a20);
  auVar6 = vsqrtss_avx(local_a20,local_a20);
  local_990 = ZEXT816(0x3f80000000000000);
  local_5a0 = fVar188;
  fStack_59c = fVar188;
  fStack_598 = fVar188;
  fStack_594 = fVar188;
  fStack_590 = fVar188;
  fStack_58c = fVar188;
  fStack_588 = fVar188;
  fStack_584 = fVar188;
  uVar96 = 0;
  fVar288 = 0.0;
  do {
    auVar9 = vmovshdup_avx(local_990);
    fVar222 = local_990._0_4_;
    fVar208 = auVar9._0_4_ - fVar222;
    fVar289 = fVar208 * 0.04761905;
    local_a80._4_4_ = fVar222;
    local_a80._0_4_ = fVar222;
    local_a80._8_4_ = fVar222;
    local_a80._12_4_ = fVar222;
    local_a80._16_4_ = fVar222;
    local_a80._20_4_ = fVar222;
    local_a80._24_4_ = fVar222;
    local_a80._28_4_ = fVar222;
    local_800._4_4_ = fVar208;
    local_800._0_4_ = fVar208;
    local_800._8_4_ = fVar208;
    local_800._12_4_ = fVar208;
    local_800._16_4_ = fVar208;
    local_800._20_4_ = fVar208;
    local_800._24_4_ = fVar208;
    local_800._28_4_ = fVar208;
    auVar9 = vfmadd231ps_fma(local_a80,local_800,_DAT_02020f20);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = &DAT_3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar218 = vsubps_avx(auVar115,ZEXT1632(auVar9));
    fVar208 = auVar218._0_4_;
    fVar224 = auVar218._4_4_;
    fVar223 = auVar218._8_4_;
    fVar262 = auVar218._12_4_;
    fVar252 = auVar218._16_4_;
    fVar263 = auVar218._20_4_;
    fVar227 = auVar218._24_4_;
    fVar99 = fVar208 * fVar208 * fVar208;
    fVar129 = fVar224 * fVar224 * fVar224;
    fVar131 = fVar223 * fVar223 * fVar223;
    fVar132 = fVar262 * fVar262 * fVar262;
    fVar133 = fVar252 * fVar252 * fVar252;
    fVar134 = fVar263 * fVar263 * fVar263;
    fVar135 = fVar227 * fVar227 * fVar227;
    fVar222 = auVar9._0_4_;
    fVar226 = auVar9._4_4_;
    fVar251 = auVar9._8_4_;
    fVar225 = auVar9._12_4_;
    fVar164 = fVar222 * fVar222 * fVar222;
    fVar185 = fVar226 * fVar226 * fVar226;
    fVar186 = fVar251 * fVar251 * fVar251;
    fVar187 = fVar225 * fVar225 * fVar225;
    fVar264 = fVar208 * fVar222;
    fVar270 = fVar224 * fVar226;
    fVar271 = fVar223 * fVar251;
    fVar272 = fVar262 * fVar225;
    fVar273 = fVar252 * 0.0;
    fVar274 = fVar263 * 0.0;
    fVar275 = fVar227 * 0.0;
    fVar281 = auVar280._28_4_ + auVar296._28_4_ + 1.0;
    fVar297 = auVar287._28_4_;
    auVar11._4_4_ = fVar129 * 0.16666667;
    auVar11._0_4_ = fVar99 * 0.16666667;
    auVar11._8_4_ = fVar131 * 0.16666667;
    auVar11._12_4_ = fVar132 * 0.16666667;
    auVar11._16_4_ = fVar133 * 0.16666667;
    auVar11._20_4_ = fVar134 * 0.16666667;
    auVar11._24_4_ = fVar135 * 0.16666667;
    auVar11._28_4_ = fVar281;
    auVar13._4_4_ =
         (fVar224 * fVar270 * 12.0 + fVar270 * fVar226 * 6.0 + fVar185 + fVar129 * 4.0) * 0.16666667
    ;
    auVar13._0_4_ =
         (fVar208 * fVar264 * 12.0 + fVar264 * fVar222 * 6.0 + fVar164 + fVar99 * 4.0) * 0.16666667;
    auVar13._8_4_ =
         (fVar223 * fVar271 * 12.0 + fVar271 * fVar251 * 6.0 + fVar186 + fVar131 * 4.0) * 0.16666667
    ;
    auVar13._12_4_ =
         (fVar262 * fVar272 * 12.0 + fVar272 * fVar225 * 6.0 + fVar187 + fVar132 * 4.0) * 0.16666667
    ;
    auVar13._16_4_ =
         (fVar252 * fVar273 * 12.0 + fVar273 * 0.0 * 6.0 + fVar133 * 4.0 + 0.0) * 0.16666667;
    auVar13._20_4_ =
         (fVar263 * fVar274 * 12.0 + fVar274 * 0.0 * 6.0 + fVar134 * 4.0 + 0.0) * 0.16666667;
    auVar13._24_4_ =
         (fVar227 * fVar275 * 12.0 + fVar275 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar13._28_4_ = fVar297;
    auVar151._4_4_ =
         (fVar185 * 4.0 + fVar129 + fVar270 * fVar226 * 12.0 + fVar224 * fVar270 * 6.0) * 0.16666667
    ;
    auVar151._0_4_ =
         (fVar164 * 4.0 + fVar99 + fVar264 * fVar222 * 12.0 + fVar208 * fVar264 * 6.0) * 0.16666667;
    auVar151._8_4_ =
         (fVar186 * 4.0 + fVar131 + fVar271 * fVar251 * 12.0 + fVar223 * fVar271 * 6.0) * 0.16666667
    ;
    auVar151._12_4_ =
         (fVar187 * 4.0 + fVar132 + fVar272 * fVar225 * 12.0 + fVar262 * fVar272 * 6.0) * 0.16666667
    ;
    auVar151._16_4_ = (fVar133 + 0.0 + fVar273 * 0.0 * 12.0 + fVar252 * fVar273 * 6.0) * 0.16666667;
    auVar151._20_4_ = (fVar134 + 0.0 + fVar274 * 0.0 * 12.0 + fVar263 * fVar274 * 6.0) * 0.16666667;
    auVar151._24_4_ = (fVar135 + 0.0 + fVar275 * 0.0 * 12.0 + fVar227 * fVar275 * 6.0) * 0.16666667;
    auVar151._28_4_ = auVar296._28_4_;
    fVar164 = fVar164 * 0.16666667;
    fVar185 = fVar185 * 0.16666667;
    fVar186 = fVar186 * 0.16666667;
    fVar187 = fVar187 * 0.16666667;
    auVar14._4_4_ = fStack_59c * fVar185;
    auVar14._0_4_ = local_5a0 * fVar164;
    auVar14._8_4_ = fStack_598 * fVar186;
    auVar14._12_4_ = fStack_594 * fVar187;
    auVar14._16_4_ = fStack_590 * 0.0;
    auVar14._20_4_ = fStack_58c * 0.0;
    auVar14._24_4_ = fStack_588 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar121._4_4_ = fVar185 * local_500._4_4_;
    auVar121._0_4_ = fVar164 * (float)local_500;
    auVar121._8_4_ = fVar186 * (float)uStack_4f8;
    auVar121._12_4_ = fVar187 * uStack_4f8._4_4_;
    auVar121._16_4_ = (float)uStack_4f0 * 0.0;
    auVar121._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar121._24_4_ = (float)uStack_4e8 * 0.0;
    auVar121._28_4_ = 0x40800000;
    auVar15._4_4_ = fVar185 * local_520._4_4_;
    auVar15._0_4_ = fVar164 * (float)local_520;
    auVar15._8_4_ = fVar186 * (float)uStack_518;
    auVar15._12_4_ = fVar187 * uStack_518._4_4_;
    auVar15._16_4_ = (float)uStack_510 * 0.0;
    auVar15._20_4_ = uStack_510._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_508 * 0.0;
    auVar15._28_4_ = 0x3e2aaaab;
    auVar268._4_4_ = fVar185 * local_540._4_4_;
    auVar268._0_4_ = fVar164 * (float)local_540;
    auVar268._8_4_ = fVar186 * (float)uStack_538;
    auVar268._12_4_ = fVar187 * uStack_538._4_4_;
    auVar268._16_4_ = (float)uStack_530 * 0.0;
    auVar268._20_4_ = uStack_530._4_4_ * 0.0;
    auVar268._24_4_ = (float)uStack_528 * 0.0;
    auVar268._28_4_ = fVar281 + fVar297 + fVar288;
    auVar116._4_4_ = uStack_57c;
    auVar116._0_4_ = local_580;
    auVar116._8_4_ = uStack_578;
    auVar116._12_4_ = uStack_574;
    auVar116._16_4_ = uStack_570;
    auVar116._20_4_ = uStack_56c;
    auVar116._24_4_ = uStack_568;
    auVar116._28_4_ = uStack_564;
    auVar9 = vfmadd231ps_fma(auVar14,auVar151,auVar116);
    auVar83._8_8_ = uStack_218;
    auVar83._0_8_ = local_220;
    auVar83._16_8_ = uStack_210;
    auVar83._24_8_ = uStack_208;
    auVar102 = vfmadd231ps_fma(auVar121,auVar151,auVar83);
    auVar75._8_8_ = uStack_4b8;
    auVar75._0_8_ = local_4c0;
    auVar75._16_8_ = uStack_4b0;
    auVar75._24_8_ = uStack_4a8;
    auVar109 = vfmadd231ps_fma(auVar15,auVar151,auVar75);
    auVar73._8_8_ = uStack_4d8;
    auVar73._0_8_ = local_4e0;
    auVar73._16_8_ = uStack_4d0;
    auVar73._24_8_ = uStack_4c8;
    auVar137 = vfmadd231ps_fma(auVar268,auVar151,auVar73);
    auVar82._4_4_ = uStack_25c;
    auVar82._0_4_ = local_260;
    auVar82._8_4_ = uStack_258;
    auVar82._12_4_ = uStack_254;
    auVar82._16_4_ = uStack_250;
    auVar82._20_4_ = uStack_24c;
    auVar82._24_4_ = uStack_248;
    auVar82._28_4_ = uStack_244;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar13,auVar82);
    auVar79._8_8_ = uStack_478;
    auVar79._0_8_ = local_480;
    auVar79._16_8_ = uStack_470;
    auVar79._24_8_ = uStack_468;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar13,auVar79);
    auVar77._8_8_ = uStack_498;
    auVar77._0_8_ = local_4a0;
    auVar77._16_8_ = uStack_490;
    auVar77._24_8_ = uStack_488;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar13,auVar77);
    auVar84._8_8_ = uStack_1f8;
    auVar84._0_8_ = local_200;
    auVar84._16_8_ = uStack_1f0;
    auVar84._24_8_ = uStack_1e8;
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar84,auVar13);
    auVar204._4_4_ = uStack_55c;
    auVar204._0_4_ = local_560;
    auVar204._8_4_ = uStack_558;
    auVar204._12_4_ = uStack_554;
    auVar204._16_4_ = uStack_550;
    auVar204._20_4_ = uStack_54c;
    auVar204._24_4_ = uStack_548;
    auVar204._28_4_ = uStack_544;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar11,auVar204);
    auVar116 = ZEXT1632(auVar9);
    auVar87._8_8_ = uStack_198;
    auVar87._0_8_ = local_1a0;
    auVar87._16_8_ = uStack_190;
    auVar87._24_8_ = uStack_188;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar11,auVar87);
    auVar204 = ZEXT1632(auVar9);
    auVar86._8_8_ = uStack_1b8;
    auVar86._0_8_ = local_1c0;
    auVar86._16_8_ = uStack_1b0;
    auVar86._24_8_ = uStack_1a8;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar11,auVar86);
    auVar85._8_8_ = uStack_1d8;
    auVar85._0_8_ = local_1e0;
    auVar85._16_8_ = uStack_1d0;
    auVar85._24_8_ = uStack_1c8;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar85,auVar11);
    auVar241._0_4_ = (float)((uint)fVar222 ^ local_760) * fVar222;
    auVar241._4_4_ = (float)((uint)fVar226 ^ uStack_75c) * fVar226;
    auVar241._8_4_ = (float)((uint)fVar251 ^ uStack_758) * fVar251;
    auVar241._12_4_ = (float)((uint)fVar225 ^ uStack_754) * fVar225;
    auVar241._16_4_ = fStack_750 * 0.0;
    auVar241._20_4_ = fStack_74c * 0.0;
    auVar241._24_4_ = fStack_748 * 0.0;
    auVar241._28_4_ = 0;
    auVar17._4_4_ = fVar270 * 4.0;
    auVar17._0_4_ = fVar264 * 4.0;
    auVar17._8_4_ = fVar271 * 4.0;
    auVar17._12_4_ = fVar272 * 4.0;
    auVar17._16_4_ = fVar273 * 4.0;
    auVar17._20_4_ = fVar274 * 4.0;
    fVar288 = auVar269._28_4_;
    auVar17._24_4_ = fVar275 * 4.0;
    auVar17._28_4_ = fVar288;
    auVar237 = vsubps_avx(auVar241,auVar17);
    auVar248._4_4_ = fVar224 * (float)((uint)fVar224 ^ uStack_75c) * 0.5;
    auVar248._0_4_ = fVar208 * (float)((uint)fVar208 ^ local_760) * 0.5;
    auVar248._8_4_ = fVar223 * (float)((uint)fVar223 ^ uStack_758) * 0.5;
    auVar248._12_4_ = fVar262 * (float)((uint)fVar262 ^ uStack_754) * 0.5;
    auVar248._16_4_ = fVar252 * (float)((uint)fVar252 ^ (uint)fStack_750) * 0.5;
    auVar248._20_4_ = fVar263 * (float)((uint)fVar263 ^ (uint)fStack_74c) * 0.5;
    auVar248._24_4_ = fVar227 * (float)((uint)fVar227 ^ (uint)fStack_748) * 0.5;
    auVar248._28_4_ = auVar218._28_4_;
    auVar18._4_4_ = auVar237._4_4_ * 0.5;
    auVar18._0_4_ = auVar237._0_4_ * 0.5;
    auVar18._8_4_ = auVar237._8_4_ * 0.5;
    auVar18._12_4_ = auVar237._12_4_ * 0.5;
    auVar18._16_4_ = auVar237._16_4_ * 0.5;
    auVar18._20_4_ = auVar237._20_4_ * 0.5;
    auVar18._24_4_ = auVar237._24_4_ * 0.5;
    auVar18._28_4_ = auVar237._28_4_;
    auVar19._4_4_ = (fVar270 * 4.0 + fVar224 * fVar224) * 0.5;
    auVar19._0_4_ = (fVar264 * 4.0 + fVar208 * fVar208) * 0.5;
    auVar19._8_4_ = (fVar271 * 4.0 + fVar223 * fVar223) * 0.5;
    auVar19._12_4_ = (fVar272 * 4.0 + fVar262 * fVar262) * 0.5;
    auVar19._16_4_ = (fVar273 * 4.0 + fVar252 * fVar252) * 0.5;
    auVar19._20_4_ = (fVar274 * 4.0 + fVar263 * fVar263) * 0.5;
    auVar19._24_4_ = (fVar275 * 4.0 + fVar227 * fVar227) * 0.5;
    auVar19._28_4_ = fVar288 + auVar250._28_4_;
    fVar208 = fVar222 * fVar222 * 0.5;
    fVar222 = fVar226 * fVar226 * 0.5;
    fVar224 = fVar251 * fVar251 * 0.5;
    fVar226 = fVar225 * fVar225 * 0.5;
    auVar236._4_4_ = fVar222 * fStack_59c;
    auVar236._0_4_ = fVar208 * local_5a0;
    auVar236._8_4_ = fVar224 * fStack_598;
    auVar236._12_4_ = fVar226 * fStack_594;
    auVar236._16_4_ = fStack_590 * 0.0;
    auVar236._20_4_ = fStack_58c * 0.0;
    auVar236._24_4_ = fStack_588 * 0.0;
    auVar236._28_4_ = fVar288;
    auVar279._4_4_ = fVar222 * local_500._4_4_;
    auVar279._0_4_ = fVar208 * (float)local_500;
    auVar279._8_4_ = fVar224 * (float)uStack_4f8;
    auVar279._12_4_ = fVar226 * uStack_4f8._4_4_;
    auVar279._16_4_ = (float)uStack_4f0 * 0.0;
    auVar279._20_4_ = uStack_4f0._4_4_ * 0.0;
    auVar279._24_4_ = (float)uStack_4e8 * 0.0;
    auVar279._28_4_ = uStack_744;
    auVar247._4_4_ = fVar222 * local_520._4_4_;
    auVar247._0_4_ = fVar208 * (float)local_520;
    auVar247._8_4_ = fVar224 * (float)uStack_518;
    auVar247._12_4_ = fVar226 * uStack_518._4_4_;
    auVar247._16_4_ = (float)uStack_510 * 0.0;
    auVar247._20_4_ = uStack_510._4_4_ * 0.0;
    auVar247._24_4_ = (float)uStack_508 * 0.0;
    auVar247._28_4_ = fVar297;
    auVar298._4_4_ = fVar222 * local_540._4_4_;
    auVar298._0_4_ = fVar208 * (float)local_540;
    auVar298._8_4_ = fVar224 * (float)uStack_538;
    auVar298._12_4_ = fVar226 * uStack_538._4_4_;
    auVar298._16_4_ = (float)uStack_530 * 0.0;
    auVar298._20_4_ = uStack_530._4_4_ * 0.0;
    auVar298._24_4_ = (float)uStack_528 * 0.0;
    auVar298._28_4_ = auVar221._28_4_;
    auVar71._4_4_ = uStack_57c;
    auVar71._0_4_ = local_580;
    auVar71._8_4_ = uStack_578;
    auVar71._12_4_ = uStack_574;
    auVar71._16_4_ = uStack_570;
    auVar71._20_4_ = uStack_56c;
    auVar71._24_4_ = uStack_568;
    auVar71._28_4_ = uStack_564;
    auVar9 = vfmadd231ps_fma(auVar236,auVar19,auVar71);
    auVar137 = vfmadd231ps_fma(auVar279,auVar19,auVar83);
    auVar76._8_8_ = uStack_4b8;
    auVar76._0_8_ = local_4c0;
    auVar76._16_8_ = uStack_4b0;
    auVar76._24_8_ = uStack_4a8;
    auVar101 = vfmadd231ps_fma(auVar247,auVar19,auVar76);
    auVar74._8_8_ = uStack_4d8;
    auVar74._0_8_ = local_4e0;
    auVar74._16_8_ = uStack_4d0;
    auVar74._24_8_ = uStack_4c8;
    auVar138 = vfmadd231ps_fma(auVar298,auVar19,auVar74);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar18,auVar82);
    auVar80._8_8_ = uStack_478;
    auVar80._0_8_ = local_480;
    auVar80._16_8_ = uStack_470;
    auVar80._24_8_ = uStack_468;
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar18,auVar80);
    auVar78._8_8_ = uStack_498;
    auVar78._0_8_ = local_4a0;
    auVar78._16_8_ = uStack_490;
    auVar78._24_8_ = uStack_488;
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar18,auVar78);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar84,auVar18);
    auVar72._4_4_ = uStack_55c;
    auVar72._0_4_ = local_560;
    auVar72._8_4_ = uStack_558;
    auVar72._12_4_ = uStack_554;
    auVar72._16_4_ = uStack_550;
    auVar72._20_4_ = uStack_54c;
    auVar72._24_4_ = uStack_548;
    auVar72._28_4_ = uStack_544;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar248,auVar72);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar248,auVar87);
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar248,auVar86);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar85,auVar248);
    auVar266._0_4_ = auVar9._0_4_ * fVar289;
    auVar266._4_4_ = auVar9._4_4_ * fVar289;
    auVar266._8_4_ = auVar9._8_4_ * fVar289;
    auVar266._12_4_ = auVar9._12_4_ * fVar289;
    auVar266._16_4_ = fVar289 * 0.0;
    auVar266._20_4_ = fVar289 * 0.0;
    auVar266._24_4_ = fVar289 * 0.0;
    auVar266._28_4_ = 0;
    fVar288 = auVar137._0_4_ * fVar289;
    fVar208 = auVar137._4_4_ * fVar289;
    local_7c0._4_4_ = fVar208;
    local_7c0._0_4_ = fVar288;
    fVar222 = auVar137._8_4_ * fVar289;
    local_7c0._8_4_ = fVar222;
    fVar224 = auVar137._12_4_ * fVar289;
    local_7c0._12_4_ = fVar224;
    local_7c0._16_4_ = fVar289 * 0.0;
    local_7c0._20_4_ = fVar289 * 0.0;
    local_7c0._24_4_ = fVar289 * 0.0;
    local_7c0._28_4_ = (int)((ulong)uStack_188 >> 0x20);
    fVar273 = auVar101._0_4_ * fVar289;
    fVar274 = auVar101._4_4_ * fVar289;
    auVar306._4_4_ = fVar274;
    auVar306._0_4_ = fVar273;
    fVar275 = auVar101._8_4_ * fVar289;
    auVar306._8_4_ = fVar275;
    fVar281 = auVar101._12_4_ * fVar289;
    auVar306._12_4_ = fVar281;
    fVar307 = fVar289 * 0.0;
    auVar306._16_4_ = fVar307;
    fVar308 = fVar289 * 0.0;
    auVar306._20_4_ = fVar308;
    fVar309 = fVar289 * 0.0;
    auVar306._24_4_ = fVar309;
    auVar306._28_4_ = (int)((ulong)uStack_1a8 >> 0x20);
    auVar216._0_4_ = fVar289 * auVar138._0_4_;
    auVar216._4_4_ = fVar289 * auVar138._4_4_;
    auVar216._8_4_ = fVar289 * auVar138._8_4_;
    auVar216._12_4_ = fVar289 * auVar138._12_4_;
    auVar216._16_4_ = fVar289 * 0.0;
    auVar216._20_4_ = fVar289 * 0.0;
    auVar216._24_4_ = fVar289 * 0.0;
    auVar216._28_4_ = 0;
    auVar17 = vpermps_avx2(_DAT_0205d4a0,auVar116);
    local_9e0 = vpermps_avx2(_DAT_0205d4a0,auVar204);
    _local_a00 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar102));
    auVar13 = vsubps_avx(auVar17,auVar116);
    auVar151 = vsubps_avx(_local_a00,ZEXT1632(auVar102));
    fVar227 = auVar151._0_4_;
    fVar129 = auVar151._4_4_;
    auVar12._4_4_ = fVar129 * auVar266._4_4_;
    auVar12._0_4_ = fVar227 * auVar266._0_4_;
    fVar131 = auVar151._8_4_;
    auVar12._8_4_ = fVar131 * auVar266._8_4_;
    fVar132 = auVar151._12_4_;
    auVar12._12_4_ = fVar132 * auVar266._12_4_;
    fVar133 = auVar151._16_4_;
    auVar12._16_4_ = fVar133 * auVar266._16_4_;
    fVar134 = auVar151._20_4_;
    auVar12._20_4_ = fVar134 * auVar266._20_4_;
    fVar135 = auVar151._24_4_;
    auVar12._24_4_ = fVar135 * auVar266._24_4_;
    auVar12._28_4_ = local_a00._28_4_;
    auVar9 = vfmsub231ps_fma(auVar12,auVar306,auVar13);
    auVar14 = vsubps_avx(local_9e0,auVar204);
    fVar310 = auVar13._0_4_;
    fVar311 = auVar13._4_4_;
    auVar20._4_4_ = fVar311 * fVar208;
    auVar20._0_4_ = fVar310 * fVar288;
    fVar312 = auVar13._8_4_;
    auVar20._8_4_ = fVar312 * fVar222;
    fVar313 = auVar13._12_4_;
    auVar20._12_4_ = fVar313 * fVar224;
    fVar314 = auVar13._16_4_;
    auVar20._16_4_ = fVar314 * fVar289 * 0.0;
    fVar315 = auVar13._20_4_;
    auVar20._20_4_ = fVar315 * fVar289 * 0.0;
    fVar316 = auVar13._24_4_;
    auVar20._24_4_ = fVar316 * fVar289 * 0.0;
    auVar20._28_4_ = auVar17._28_4_;
    auVar137 = vfmsub231ps_fma(auVar20,auVar266,auVar14);
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar137._12_4_ * auVar137._12_4_,
                                                CONCAT48(auVar137._8_4_ * auVar137._8_4_,
                                                         CONCAT44(auVar137._4_4_ * auVar137._4_4_,
                                                                  auVar137._0_4_ * auVar137._0_4_)))
                                     ),ZEXT1632(auVar9),ZEXT1632(auVar9));
    fVar164 = auVar14._0_4_;
    fVar185 = auVar14._4_4_;
    auVar21._4_4_ = fVar185 * fVar274;
    auVar21._0_4_ = fVar164 * fVar273;
    fVar186 = auVar14._8_4_;
    auVar21._8_4_ = fVar186 * fVar275;
    fVar187 = auVar14._12_4_;
    auVar21._12_4_ = fVar187 * fVar281;
    fVar264 = auVar14._16_4_;
    auVar21._16_4_ = fVar264 * fVar307;
    fVar270 = auVar14._20_4_;
    auVar21._20_4_ = fVar270 * fVar308;
    fVar271 = auVar14._24_4_;
    auVar21._24_4_ = fVar271 * fVar309;
    auVar21._28_4_ = local_9e0._28_4_;
    auVar101 = vfmsub231ps_fma(auVar21,local_7c0,auVar151);
    auVar242._0_4_ = fVar227 * fVar227;
    auVar242._4_4_ = fVar129 * fVar129;
    auVar242._8_4_ = fVar131 * fVar131;
    auVar242._12_4_ = fVar132 * fVar132;
    auVar242._16_4_ = fVar133 * fVar133;
    auVar242._20_4_ = fVar134 * fVar134;
    auVar242._24_4_ = fVar135 * fVar135;
    auVar242._28_4_ = 0;
    auVar137 = vfmadd231ps_fma(auVar242,auVar14,auVar14);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar13,auVar13);
    auVar218 = vrcpps_avx(ZEXT1632(auVar137));
    auVar101 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar101),ZEXT1632(auVar101));
    auVar173._8_4_ = 0x3f800000;
    auVar173._0_8_ = &DAT_3f8000003f800000;
    auVar173._12_4_ = 0x3f800000;
    auVar173._16_4_ = 0x3f800000;
    auVar173._20_4_ = 0x3f800000;
    auVar173._24_4_ = 0x3f800000;
    auVar173._28_4_ = 0x3f800000;
    auVar9 = vfnmadd213ps_fma(auVar218,ZEXT1632(auVar137),auVar173);
    auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar218,auVar218);
    auVar248 = vpermps_avx2(_DAT_0205d4a0,auVar266);
    local_7e0 = vpermps_avx2(_DAT_0205d4a0,auVar306);
    auVar22._4_4_ = fVar129 * auVar248._4_4_;
    auVar22._0_4_ = fVar227 * auVar248._0_4_;
    auVar22._8_4_ = fVar131 * auVar248._8_4_;
    auVar22._12_4_ = fVar132 * auVar248._12_4_;
    auVar22._16_4_ = fVar133 * auVar248._16_4_;
    auVar22._20_4_ = fVar134 * auVar248._20_4_;
    auVar22._24_4_ = fVar135 * auVar248._24_4_;
    auVar22._28_4_ = auVar218._28_4_;
    auVar138 = vfmsub231ps_fma(auVar22,local_7e0,auVar13);
    local_a40 = vpermps_avx2(_DAT_0205d4a0,local_7c0);
    auVar23._4_4_ = fVar311 * local_a40._4_4_;
    auVar23._0_4_ = fVar310 * local_a40._0_4_;
    auVar23._8_4_ = fVar312 * local_a40._8_4_;
    auVar23._12_4_ = fVar313 * local_a40._12_4_;
    auVar23._16_4_ = fVar314 * local_a40._16_4_;
    auVar23._20_4_ = fVar315 * local_a40._20_4_;
    auVar23._24_4_ = fVar316 * local_a40._24_4_;
    auVar23._28_4_ = 0;
    auVar189 = vfmsub231ps_fma(auVar23,auVar248,auVar14);
    auVar138 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar189._12_4_ * auVar189._12_4_,
                                                  CONCAT48(auVar189._8_4_ * auVar189._8_4_,
                                                           CONCAT44(auVar189._4_4_ * auVar189._4_4_,
                                                                    auVar189._0_4_ * auVar189._0_4_)
                                                          ))),ZEXT1632(auVar138),ZEXT1632(auVar138))
    ;
    fVar208 = local_7e0._0_4_;
    auVar255._0_4_ = fVar164 * fVar208;
    fVar224 = local_7e0._4_4_;
    auVar255._4_4_ = fVar185 * fVar224;
    fVar251 = local_7e0._8_4_;
    auVar255._8_4_ = fVar186 * fVar251;
    fVar252 = local_7e0._12_4_;
    auVar255._12_4_ = fVar187 * fVar252;
    fVar289 = local_7e0._16_4_;
    auVar255._16_4_ = fVar264 * fVar289;
    fVar297 = local_7e0._20_4_;
    auVar255._20_4_ = fVar270 * fVar297;
    fVar99 = local_7e0._24_4_;
    auVar255._24_4_ = fVar271 * fVar99;
    auVar255._28_4_ = 0;
    auVar189 = vfmsub231ps_fma(auVar255,local_a40,auVar151);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),ZEXT1632(auVar189),ZEXT1632(auVar189));
    auVar218 = vmaxps_avx(ZEXT1632(CONCAT412(auVar101._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar101._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar101._4_4_ * auVar9._4_4_,
                                                               auVar101._0_4_ * auVar9._0_4_)))),
                          ZEXT1632(CONCAT412(auVar138._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar138._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar138._4_4_ * auVar9._4_4_,
                                                               auVar138._0_4_ * auVar9._0_4_)))));
    local_820._0_4_ = auVar216._0_4_ + auVar109._0_4_;
    local_820._4_4_ = auVar216._4_4_ + auVar109._4_4_;
    local_820._8_4_ = auVar216._8_4_ + auVar109._8_4_;
    local_820._12_4_ = auVar216._12_4_ + auVar109._12_4_;
    local_820._16_4_ = auVar216._16_4_ + 0.0;
    local_820._20_4_ = auVar216._20_4_ + 0.0;
    local_820._24_4_ = auVar216._24_4_ + 0.0;
    local_820._28_4_ = 0;
    auVar237 = vsubps_avx(ZEXT1632(auVar109),auVar216);
    local_840 = vpermps_avx2(_DAT_0205d4a0,auVar237);
    auVar236 = ZEXT1632(auVar109);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar236);
    auStack_850 = auVar18._16_16_;
    auVar237 = vmaxps_avx(auVar236,local_820);
    auVar114 = vmaxps_avx(local_840,auVar18);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar137));
    auVar114 = vmaxps_avx(auVar237,auVar114);
    uVar95 = auVar237._28_4_;
    fVar288 = auVar11._0_4_;
    fVar222 = auVar11._4_4_;
    fVar226 = auVar11._8_4_;
    fVar223 = auVar11._12_4_;
    fVar262 = auVar11._16_4_;
    fVar225 = auVar11._20_4_;
    fVar263 = auVar11._24_4_;
    auVar267._0_4_ = fVar288 * fVar288 * fVar288 * auVar137._0_4_ * -0.5;
    auVar267._4_4_ = fVar222 * fVar222 * fVar222 * auVar137._4_4_ * -0.5;
    auVar267._8_4_ = fVar226 * fVar226 * fVar226 * auVar137._8_4_ * -0.5;
    auVar267._12_4_ = fVar223 * fVar223 * fVar223 * auVar137._12_4_ * -0.5;
    auVar267._16_4_ = fVar262 * fVar262 * fVar262 * -0.0;
    auVar267._20_4_ = fVar225 * fVar225 * fVar225 * -0.0;
    auVar267._24_4_ = fVar263 * fVar263 * fVar263 * -0.0;
    auVar267._28_4_ = 0;
    auVar117._8_4_ = 0x3fc00000;
    auVar117._0_8_ = 0x3fc000003fc00000;
    auVar117._12_4_ = 0x3fc00000;
    auVar117._16_4_ = 0x3fc00000;
    auVar117._20_4_ = 0x3fc00000;
    auVar117._24_4_ = 0x3fc00000;
    auVar117._28_4_ = 0x3fc00000;
    auVar9 = vfmadd231ps_fma(auVar267,auVar117,auVar11);
    auVar269 = ZEXT1664(auVar9);
    fVar222 = auVar9._0_4_;
    fVar226 = auVar9._4_4_;
    auVar24._4_4_ = fVar185 * fVar226;
    auVar24._0_4_ = fVar164 * fVar222;
    fVar262 = auVar9._8_4_;
    auVar24._8_4_ = fVar186 * fVar262;
    fVar263 = auVar9._12_4_;
    auVar24._12_4_ = fVar187 * fVar263;
    auVar24._16_4_ = fVar264 * 0.0;
    auVar24._20_4_ = fVar270 * 0.0;
    auVar24._24_4_ = fVar271 * 0.0;
    auVar24._28_4_ = uVar95;
    auVar25._4_4_ = (float)local_a60._4_4_ * fVar129 * fVar226;
    auVar25._0_4_ = (float)local_a60._0_4_ * fVar227 * fVar222;
    auVar25._8_4_ = fStack_a58 * fVar131 * fVar262;
    auVar25._12_4_ = fStack_a54 * fVar132 * fVar263;
    auVar25._16_4_ = fStack_a50 * fVar133 * 0.0;
    auVar25._20_4_ = fStack_a4c * fVar134 * 0.0;
    auVar25._24_4_ = fStack_a48 * fVar135 * 0.0;
    auVar25._28_4_ = auVar151._28_4_;
    auVar9 = vfmadd231ps_fma(auVar25,auVar24,_local_8e0);
    auVar296 = ZEXT864(0) << 0x20;
    auVar298 = ZEXT1632(auVar102);
    auVar237 = vsubps_avx(ZEXT832(0) << 0x20,auVar298);
    auVar287 = ZEXT3264(auVar237);
    fVar185 = auVar237._0_4_;
    fVar186 = auVar237._4_4_;
    auVar26._4_4_ = fVar186 * fVar129 * fVar226;
    auVar26._0_4_ = fVar185 * fVar227 * fVar222;
    fVar187 = auVar237._8_4_;
    auVar26._8_4_ = fVar187 * fVar131 * fVar262;
    fVar264 = auVar237._12_4_;
    auVar26._12_4_ = fVar264 * fVar132 * fVar263;
    fVar270 = auVar237._16_4_;
    auVar26._16_4_ = fVar270 * fVar133 * 0.0;
    fVar271 = auVar237._20_4_;
    auVar26._20_4_ = fVar271 * fVar134 * 0.0;
    fVar272 = auVar237._24_4_;
    auVar26._24_4_ = fVar272 * fVar135 * 0.0;
    auVar26._28_4_ = local_7e0._28_4_;
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,auVar204);
    auVar102 = vfmadd231ps_fma(auVar26,auVar11,auVar24);
    auVar27._4_4_ = fVar311 * fVar226;
    auVar27._0_4_ = fVar310 * fVar222;
    auVar27._8_4_ = fVar312 * fVar262;
    auVar27._12_4_ = fVar313 * fVar263;
    auVar27._16_4_ = fVar314 * 0.0;
    auVar27._20_4_ = fVar315 * 0.0;
    auVar27._24_4_ = fVar316 * 0.0;
    auVar27._28_4_ = uVar95;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar27,auVar278);
    auVar280 = ZEXT1664(auVar9);
    auVar247 = ZEXT832(0) << 0x20;
    auVar121 = vsubps_avx(auVar247,auVar116);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar121,auVar27);
    auVar28._4_4_ = fVar186 * (float)local_a60._4_4_;
    auVar28._0_4_ = fVar185 * (float)local_a60._0_4_;
    auVar28._8_4_ = fVar187 * fStack_a58;
    auVar28._12_4_ = fVar264 * fStack_a54;
    auVar28._16_4_ = fVar270 * fStack_a50;
    auVar28._20_4_ = fVar271 * fStack_a4c;
    auVar28._24_4_ = fVar272 * fStack_a48;
    auVar28._28_4_ = uVar95;
    auVar109 = vfmadd231ps_fma(auVar28,_local_8e0,auVar11);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar278,auVar121);
    fVar288 = auVar102._0_4_;
    fVar133 = auVar9._0_4_;
    fVar223 = auVar102._4_4_;
    fVar134 = auVar9._4_4_;
    fVar225 = auVar102._8_4_;
    fVar135 = auVar9._8_4_;
    fVar227 = auVar102._12_4_;
    fVar164 = auVar9._12_4_;
    auVar29._28_4_ = local_8e0._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar164 * fVar227,
                            CONCAT48(fVar135 * fVar225,CONCAT44(fVar134 * fVar223,fVar133 * fVar288)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar109),auVar29);
    auVar30._4_4_ = fVar186 * fVar186;
    auVar30._0_4_ = fVar185 * fVar185;
    auVar30._8_4_ = fVar187 * fVar187;
    auVar30._12_4_ = fVar264 * fVar264;
    auVar30._16_4_ = fVar270 * fVar270;
    auVar30._20_4_ = fVar271 * fVar271;
    auVar30._24_4_ = fVar272 * fVar272;
    auVar30._28_4_ = local_8e0._28_4_;
    auVar109 = vfmadd231ps_fma(auVar30,auVar11,auVar11);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar121,auVar121);
    local_880 = vsubps_avx(ZEXT1632(auVar109),
                           ZEXT1632(CONCAT412(fVar227 * fVar227,
                                              CONCAT48(fVar225 * fVar225,
                                                       CONCAT44(fVar223 * fVar223,fVar288 * fVar288)
                                                      ))));
    auVar237 = vsqrtps_avx(auVar218);
    fVar288 = (auVar237._0_4_ + auVar114._0_4_) * 1.0000002;
    fVar223 = (auVar237._4_4_ + auVar114._4_4_) * 1.0000002;
    fVar225 = (auVar237._8_4_ + auVar114._8_4_) * 1.0000002;
    fVar227 = (auVar237._12_4_ + auVar114._12_4_) * 1.0000002;
    fVar129 = (auVar237._16_4_ + auVar114._16_4_) * 1.0000002;
    fVar131 = (auVar237._20_4_ + auVar114._20_4_) * 1.0000002;
    fVar132 = (auVar237._24_4_ + auVar114._24_4_) * 1.0000002;
    auVar31._4_4_ = fVar223 * fVar223;
    auVar31._0_4_ = fVar288 * fVar288;
    auVar31._8_4_ = fVar225 * fVar225;
    auVar31._12_4_ = fVar227 * fVar227;
    auVar31._16_4_ = fVar129 * fVar129;
    auVar31._20_4_ = fVar131 * fVar131;
    auVar31._24_4_ = fVar132 * fVar132;
    auVar31._28_4_ = auVar237._28_4_ + auVar114._28_4_;
    auVar174._0_4_ = auVar15._0_4_ + auVar15._0_4_;
    auVar174._4_4_ = auVar15._4_4_ + auVar15._4_4_;
    auVar174._8_4_ = auVar15._8_4_ + auVar15._8_4_;
    auVar174._12_4_ = auVar15._12_4_ + auVar15._12_4_;
    auVar174._16_4_ = auVar15._16_4_ + auVar15._16_4_;
    auVar174._20_4_ = auVar15._20_4_ + auVar15._20_4_;
    auVar174._24_4_ = auVar15._24_4_ + auVar15._24_4_;
    auVar174._28_4_ = auVar15._28_4_ + auVar15._28_4_;
    auVar114 = vsubps_avx(local_880,auVar31);
    auVar250 = ZEXT3264(auVar114);
    auVar279 = ZEXT1632(auVar9);
    auVar19 = ZEXT1632(CONCAT412(fVar164 * fVar164,
                                 CONCAT48(fVar135 * fVar135,
                                          CONCAT44(fVar134 * fVar134,fVar133 * fVar133))));
    auVar15 = vsubps_avx(local_240,auVar19);
    auVar32._4_4_ = auVar174._4_4_ * auVar174._4_4_;
    auVar32._0_4_ = auVar174._0_4_ * auVar174._0_4_;
    auVar32._8_4_ = auVar174._8_4_ * auVar174._8_4_;
    auVar32._12_4_ = auVar174._12_4_ * auVar174._12_4_;
    auVar32._16_4_ = auVar174._16_4_ * auVar174._16_4_;
    auVar32._20_4_ = auVar174._20_4_ * auVar174._20_4_;
    auVar32._24_4_ = auVar174._24_4_ * auVar174._24_4_;
    auVar32._28_4_ = 0x3f800002;
    fVar223 = auVar15._0_4_;
    fVar225 = auVar15._4_4_;
    fVar227 = auVar15._8_4_;
    fVar129 = auVar15._12_4_;
    fVar131 = auVar15._16_4_;
    fVar132 = auVar15._20_4_;
    fVar133 = auVar15._24_4_;
    auVar33._4_4_ = fVar225 * 4.0 * auVar114._4_4_;
    auVar33._0_4_ = fVar223 * 4.0 * auVar114._0_4_;
    auVar33._8_4_ = fVar227 * 4.0 * auVar114._8_4_;
    auVar33._12_4_ = fVar129 * 4.0 * auVar114._12_4_;
    auVar33._16_4_ = fVar131 * 4.0 * auVar114._16_4_;
    auVar33._20_4_ = fVar132 * 4.0 * auVar114._20_4_;
    auVar33._24_4_ = fVar133 * 4.0 * auVar114._24_4_;
    auVar33._28_4_ = 0x40800000;
    auVar268 = vsubps_avx(auVar32,auVar33);
    auVar218 = vcmpps_avx(auVar268,auVar247,5);
    auVar306 = ZEXT1632(auVar102);
    fVar288 = auVar15._28_4_;
    if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar218 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar218 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar218 >> 0x7f,0) == '\0') &&
          (auVar218 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar218 >> 0xbf,0) == '\0') &&
        (auVar218 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar218[0x1f])
    {
      auVar175._8_4_ = 0x7f800000;
      auVar175._0_8_ = 0x7f8000007f800000;
      auVar175._12_4_ = 0x7f800000;
      auVar175._16_4_ = 0x7f800000;
      auVar175._20_4_ = 0x7f800000;
      auVar175._24_4_ = 0x7f800000;
      auVar175._28_4_ = 0x7f800000;
      auVar205._8_4_ = 0xff800000;
      auVar205._0_8_ = 0xff800000ff800000;
      auVar205._12_4_ = 0xff800000;
      auVar205._16_4_ = 0xff800000;
      auVar205._20_4_ = 0xff800000;
      auVar205._24_4_ = 0xff800000;
      auVar205._28_4_ = 0xff800000;
    }
    else {
      auVar247 = vcmpps_avx(auVar268,auVar247,5);
      auVar12 = vsqrtps_avx(auVar268);
      auVar299._0_4_ = fVar223 + fVar223;
      auVar299._4_4_ = fVar225 + fVar225;
      auVar299._8_4_ = fVar227 + fVar227;
      auVar299._12_4_ = fVar129 + fVar129;
      auVar299._16_4_ = fVar131 + fVar131;
      auVar299._20_4_ = fVar132 + fVar132;
      auVar299._24_4_ = fVar133 + fVar133;
      auVar299._28_4_ = fVar288 + fVar288;
      auVar268 = vrcpps_avx(auVar299);
      auVar217._8_4_ = 0x3f800000;
      auVar217._0_8_ = &DAT_3f8000003f800000;
      auVar217._12_4_ = 0x3f800000;
      auVar217._16_4_ = 0x3f800000;
      auVar217._20_4_ = 0x3f800000;
      auVar217._24_4_ = 0x3f800000;
      auVar217._28_4_ = 0x3f800000;
      auVar9 = vfnmadd213ps_fma(auVar299,auVar268,auVar217);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar268,auVar268);
      auVar291._0_4_ = (uint)auVar174._0_4_ ^ local_760;
      auVar291._4_4_ = (uint)auVar174._4_4_ ^ uStack_75c;
      auVar291._8_4_ = (uint)auVar174._8_4_ ^ uStack_758;
      auVar291._12_4_ = (uint)auVar174._12_4_ ^ uStack_754;
      auVar291._16_4_ = (uint)auVar174._16_4_ ^ (uint)fStack_750;
      auVar291._20_4_ = (uint)auVar174._20_4_ ^ (uint)fStack_74c;
      auVar291._24_4_ = (uint)auVar174._24_4_ ^ (uint)fStack_748;
      auVar291._28_4_ = (uint)auVar174._28_4_ ^ uStack_744;
      auVar268 = vsubps_avx(auVar291,auVar12);
      auVar34._4_4_ = auVar268._4_4_ * auVar9._4_4_;
      auVar34._0_4_ = auVar268._0_4_ * auVar9._0_4_;
      auVar34._8_4_ = auVar268._8_4_ * auVar9._8_4_;
      auVar34._12_4_ = auVar268._12_4_ * auVar9._12_4_;
      auVar34._16_4_ = auVar268._16_4_ * 0.0;
      auVar34._20_4_ = auVar268._20_4_ * 0.0;
      auVar34._24_4_ = auVar268._24_4_ * 0.0;
      auVar34._28_4_ = auVar268._28_4_;
      auVar268 = vsubps_avx(auVar12,auVar174);
      auVar35._4_4_ = auVar9._4_4_ * auVar268._4_4_;
      auVar35._0_4_ = auVar9._0_4_ * auVar268._0_4_;
      auVar35._8_4_ = auVar9._8_4_ * auVar268._8_4_;
      auVar35._12_4_ = auVar9._12_4_ * auVar268._12_4_;
      auVar35._16_4_ = auVar268._16_4_ * 0.0;
      auVar35._20_4_ = auVar268._20_4_ * 0.0;
      auVar35._24_4_ = auVar268._24_4_ * 0.0;
      auVar35._28_4_ = auVar268._28_4_;
      auVar9 = vfmadd213ps_fma(auVar279,auVar34,auVar306);
      local_660 = ZEXT1632(CONCAT412(fVar263 * auVar9._12_4_,
                                     CONCAT48(fVar262 * auVar9._8_4_,
                                              CONCAT44(fVar226 * auVar9._4_4_,fVar222 * auVar9._0_4_
                                                      ))));
      auVar9 = vfmadd213ps_fma(auVar279,auVar35,auVar306);
      local_680 = ZEXT1632(CONCAT412(fVar263 * auVar9._12_4_,
                                     CONCAT48(fVar262 * auVar9._8_4_,
                                              CONCAT44(fVar226 * auVar9._4_4_,fVar222 * auVar9._0_4_
                                                      ))));
      auVar148._8_4_ = 0x7f800000;
      auVar148._0_8_ = 0x7f8000007f800000;
      auVar148._12_4_ = 0x7f800000;
      auVar148._16_4_ = 0x7f800000;
      auVar148._20_4_ = 0x7f800000;
      auVar148._24_4_ = 0x7f800000;
      auVar148._28_4_ = 0x7f800000;
      auVar175 = vblendvps_avx(auVar148,auVar34,auVar247);
      auVar66._4_4_ = uStack_8fc;
      auVar66._0_4_ = local_900;
      auVar66._8_4_ = uStack_8f8;
      auVar66._12_4_ = uStack_8f4;
      auVar66._16_4_ = uStack_8f0;
      auVar66._20_4_ = uStack_8ec;
      auVar66._24_4_ = uStack_8e8;
      auVar66._28_4_ = uStack_8e4;
      auVar268 = vandps_avx(auVar19,auVar66);
      auVar268 = vmaxps_avx(local_5c0,auVar268);
      auVar16._4_4_ = auVar268._4_4_ * 1.9073486e-06;
      auVar16._0_4_ = auVar268._0_4_ * 1.9073486e-06;
      auVar16._8_4_ = auVar268._8_4_ * 1.9073486e-06;
      auVar16._12_4_ = auVar268._12_4_ * 1.9073486e-06;
      auVar16._16_4_ = auVar268._16_4_ * 1.9073486e-06;
      auVar16._20_4_ = auVar268._20_4_ * 1.9073486e-06;
      auVar16._24_4_ = auVar268._24_4_ * 1.9073486e-06;
      auVar16._28_4_ = auVar268._28_4_;
      auVar268 = vandps_avx(auVar15,auVar66);
      auVar268 = vcmpps_avx(auVar268,auVar16,1);
      auVar149._8_4_ = 0xff800000;
      auVar149._0_8_ = 0xff800000ff800000;
      auVar149._12_4_ = 0xff800000;
      auVar149._16_4_ = 0xff800000;
      auVar149._20_4_ = 0xff800000;
      auVar149._24_4_ = 0xff800000;
      auVar149._28_4_ = 0xff800000;
      auVar205 = vblendvps_avx(auVar149,auVar35,auVar247);
      auVar12 = auVar247 & auVar268;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar218 = vandps_avx(auVar268,auVar247);
        auVar268 = vcmpps_avx(auVar114,_DAT_02020f00,2);
        auVar250 = ZEXT3264(auVar268);
        auVar126._8_4_ = 0xff800000;
        auVar126._0_8_ = 0xff800000ff800000;
        auVar126._12_4_ = 0xff800000;
        auVar126._16_4_ = 0xff800000;
        auVar126._20_4_ = 0xff800000;
        auVar126._24_4_ = 0xff800000;
        auVar126._28_4_ = 0xff800000;
        auVar163._8_4_ = 0x7f800000;
        auVar163._0_8_ = 0x7f8000007f800000;
        auVar163._12_4_ = 0x7f800000;
        auVar163._16_4_ = 0x7f800000;
        auVar163._20_4_ = 0x7f800000;
        auVar163._24_4_ = 0x7f800000;
        auVar163._28_4_ = 0x7f800000;
        auVar114 = vblendvps_avx(auVar163,auVar126,auVar268);
        auVar9 = vpackssdw_avx(auVar218._0_16_,auVar218._16_16_);
        auVar16 = vpmovsxwd_avx2(auVar9);
        auVar175 = vblendvps_avx(auVar175,auVar114,auVar16);
        auVar114 = vblendvps_avx(auVar126,auVar163,auVar268);
        auVar205 = vblendvps_avx(auVar205,auVar114,auVar16);
        auVar220._0_8_ = auVar218._0_8_ ^ 0xffffffffffffffff;
        auVar220._8_4_ = auVar218._8_4_ ^ 0xffffffff;
        auVar220._12_4_ = auVar218._12_4_ ^ 0xffffffff;
        auVar220._16_4_ = auVar218._16_4_ ^ 0xffffffff;
        auVar220._20_4_ = auVar218._20_4_ ^ 0xffffffff;
        auVar220._24_4_ = auVar218._24_4_ ^ 0xffffffff;
        auVar220._28_4_ = auVar218._28_4_ ^ 0xffffffff;
        auVar218 = vorps_avx(auVar268,auVar220);
        auVar218 = vandps_avx(auVar247,auVar218);
      }
      auVar296 = ZEXT3264(auVar16);
    }
    auVar221 = ZEXT3264(local_280);
    auVar114 = local_280 & auVar218;
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar114 >> 0x7f,0) != '\0') ||
          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar114 >> 0xbf,0) != '\0') ||
        (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar114[0x1f] < '\0') {
      fVar134 = *(float *)(ray + k * 4 + 0x100) - (float)local_9a0._0_4_;
      auVar246._4_4_ = fVar134;
      auVar246._0_4_ = fVar134;
      auVar246._8_4_ = fVar134;
      auVar246._12_4_ = fVar134;
      auVar246._16_4_ = fVar134;
      auVar246._20_4_ = fVar134;
      auVar246._24_4_ = fVar134;
      auVar246._28_4_ = fVar134;
      auVar268 = vminps_avx(auVar246,auVar205);
      auVar36._4_4_ = fVar274 * fVar186;
      auVar36._0_4_ = fVar273 * fVar185;
      auVar36._8_4_ = fVar275 * fVar187;
      auVar36._12_4_ = fVar281 * fVar264;
      auVar36._16_4_ = fVar307 * fVar270;
      auVar36._20_4_ = fVar308 * fVar271;
      auVar36._24_4_ = fVar309 * fVar272;
      auVar36._28_4_ = fVar134;
      auVar9 = vfmadd213ps_fma(auVar11,local_7c0,auVar36);
      auVar102 = vfmadd213ps_fma(auVar121,auVar266,ZEXT1632(auVar9));
      auVar37._4_4_ = fVar274 * (float)local_a60._4_4_;
      auVar37._0_4_ = fVar273 * (float)local_a60._0_4_;
      auVar37._8_4_ = fVar275 * fStack_a58;
      auVar37._12_4_ = fVar281 * fStack_a54;
      auVar37._16_4_ = fVar307 * fStack_a50;
      auVar37._20_4_ = fVar308 * fStack_a4c;
      auVar37._24_4_ = fVar309 * fStack_a48;
      auVar37._28_4_ = fVar134;
      auVar9 = vfmadd231ps_fma(auVar37,_local_8e0,local_7c0);
      auVar109 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar278,auVar266);
      auVar67._4_4_ = uStack_8fc;
      auVar67._0_4_ = local_900;
      auVar67._8_4_ = uStack_8f8;
      auVar67._12_4_ = uStack_8f4;
      auVar67._16_4_ = uStack_8f0;
      auVar67._20_4_ = uStack_8ec;
      auVar67._24_4_ = uStack_8e8;
      auVar67._28_4_ = uStack_8e4;
      auVar114 = vandps_avx(ZEXT1632(auVar109),auVar67);
      auVar150._8_4_ = 0x219392ef;
      auVar150._0_8_ = 0x219392ef219392ef;
      auVar150._12_4_ = 0x219392ef;
      auVar150._16_4_ = 0x219392ef;
      auVar150._20_4_ = 0x219392ef;
      auVar150._24_4_ = 0x219392ef;
      auVar150._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar114,auVar150,1);
      auVar114 = vrcpps_avx(ZEXT1632(auVar109));
      auVar300._8_4_ = 0x3f800000;
      auVar300._0_8_ = &DAT_3f8000003f800000;
      auVar300._12_4_ = 0x3f800000;
      auVar300._16_4_ = 0x3f800000;
      auVar300._20_4_ = 0x3f800000;
      auVar300._24_4_ = 0x3f800000;
      auVar300._28_4_ = 0x3f800000;
      auVar247 = ZEXT1632(auVar109);
      auVar9 = vfnmadd213ps_fma(auVar114,auVar247,auVar300);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar114,auVar114);
      auVar286._0_4_ = auVar109._0_4_ ^ local_760;
      auVar286._4_4_ = auVar109._4_4_ ^ uStack_75c;
      auVar286._8_4_ = auVar109._8_4_ ^ uStack_758;
      auVar286._12_4_ = auVar109._12_4_ ^ uStack_754;
      auVar286._16_4_ = fStack_750;
      auVar286._20_4_ = fStack_74c;
      auVar286._24_4_ = fStack_748;
      auVar286._28_4_ = uStack_744;
      auVar292._0_4_ = auVar9._0_4_ * (float)(auVar102._0_4_ ^ local_760);
      auVar292._4_4_ = auVar9._4_4_ * (float)(auVar102._4_4_ ^ uStack_75c);
      auVar292._8_4_ = auVar9._8_4_ * (float)(auVar102._8_4_ ^ uStack_758);
      auVar292._12_4_ = auVar9._12_4_ * (float)(auVar102._12_4_ ^ uStack_754);
      auVar292._16_4_ = fStack_750 * 0.0;
      auVar292._20_4_ = fStack_74c * 0.0;
      auVar292._24_4_ = fStack_748 * 0.0;
      auVar292._28_4_ = 0;
      auVar114 = vcmpps_avx(auVar247,auVar286,1);
      auVar114 = vorps_avx(auVar11,auVar114);
      auVar301._8_4_ = 0xff800000;
      auVar301._0_8_ = 0xff800000ff800000;
      auVar301._12_4_ = 0xff800000;
      auVar301._16_4_ = 0xff800000;
      auVar301._20_4_ = 0xff800000;
      auVar301._24_4_ = 0xff800000;
      auVar301._28_4_ = 0xff800000;
      auVar114 = vblendvps_avx(auVar292,auVar301,auVar114);
      auVar81._4_4_ = fStack_29c;
      auVar81._0_4_ = local_2a0;
      auVar81._8_4_ = fStack_298;
      auVar81._12_4_ = fStack_294;
      auVar81._16_4_ = fStack_290;
      auVar81._20_4_ = fStack_28c;
      auVar81._24_4_ = fStack_288;
      auVar81._28_4_ = fStack_284;
      auVar121 = vmaxps_avx(auVar81,auVar175);
      auVar121 = vmaxps_avx(auVar121,auVar114);
      auVar114 = vcmpps_avx(auVar247,auVar286,6);
      auVar114 = vorps_avx(auVar11,auVar114);
      auVar256._8_4_ = 0x7f800000;
      auVar256._0_8_ = 0x7f8000007f800000;
      auVar256._12_4_ = 0x7f800000;
      auVar256._16_4_ = 0x7f800000;
      auVar256._20_4_ = 0x7f800000;
      auVar256._24_4_ = 0x7f800000;
      auVar256._28_4_ = 0x7f800000;
      auVar114 = vblendvps_avx(auVar292,auVar256,auVar114);
      auVar268 = vminps_avx(auVar268,auVar114);
      auVar114 = vsubps_avx(ZEXT832(0) << 0x20,local_9e0);
      auVar11 = vsubps_avx(ZEXT832(0) << 0x20,_local_a00);
      auVar38._4_4_ = auVar11._4_4_ * fVar224;
      auVar38._0_4_ = auVar11._0_4_ * fVar208;
      auVar38._8_4_ = auVar11._8_4_ * fVar251;
      auVar38._12_4_ = auVar11._12_4_ * fVar252;
      auVar38._16_4_ = auVar11._16_4_ * fVar289;
      auVar38._20_4_ = auVar11._20_4_ * fVar297;
      auVar38._24_4_ = auVar11._24_4_ * fVar99;
      auVar38._28_4_ = auVar11._28_4_;
      auVar9 = vfnmsub231ps_fma(auVar38,local_a40,auVar114);
      auVar114 = vsubps_avx(ZEXT832(0) << 0x20,auVar17);
      auVar102 = vfnmadd231ps_fma(ZEXT1632(auVar9),auVar248,auVar114);
      auVar39._4_4_ = fVar224 * (float)local_a60._4_4_;
      auVar39._0_4_ = fVar208 * (float)local_a60._0_4_;
      auVar39._8_4_ = fVar251 * fStack_a58;
      auVar39._12_4_ = fVar252 * fStack_a54;
      auVar39._16_4_ = fVar289 * fStack_a50;
      auVar39._20_4_ = fVar297 * fStack_a4c;
      auVar39._24_4_ = fVar99 * fStack_a48;
      auVar39._28_4_ = auVar114._28_4_;
      auVar9 = vfnmsub231ps_fma(auVar39,local_a40,_local_8e0);
      auVar109 = vfnmadd231ps_fma(ZEXT1632(auVar9),auVar278,auVar248);
      auVar250 = ZEXT1664(auVar109);
      auVar176._8_4_ = 0x3f800000;
      auVar176._0_8_ = &DAT_3f8000003f800000;
      auVar176._12_4_ = 0x3f800000;
      auVar176._16_4_ = 0x3f800000;
      auVar176._20_4_ = 0x3f800000;
      auVar176._24_4_ = 0x3f800000;
      auVar176._28_4_ = 0x3f800000;
      auVar114 = vandps_avx(ZEXT1632(auVar109),auVar67);
      auVar17 = vrcpps_avx(ZEXT1632(auVar109));
      auVar118._8_4_ = 0x219392ef;
      auVar118._0_8_ = 0x219392ef219392ef;
      auVar118._12_4_ = 0x219392ef;
      auVar118._16_4_ = 0x219392ef;
      auVar118._20_4_ = 0x219392ef;
      auVar118._24_4_ = 0x219392ef;
      auVar118._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar114,auVar118,1);
      auVar287 = ZEXT3264(auVar11);
      auVar248 = ZEXT1632(auVar109);
      auVar9 = vfnmadd213ps_fma(auVar17,auVar248,auVar176);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar17,auVar17);
      auVar293._0_4_ = auVar109._0_4_ ^ local_760;
      auVar293._4_4_ = auVar109._4_4_ ^ uStack_75c;
      auVar293._8_4_ = auVar109._8_4_ ^ uStack_758;
      auVar293._12_4_ = auVar109._12_4_ ^ uStack_754;
      auVar293._16_4_ = fStack_750;
      auVar293._20_4_ = fStack_74c;
      auVar293._24_4_ = fStack_748;
      auVar293._28_4_ = uStack_744;
      auVar296 = ZEXT3264(auVar293);
      auVar40._4_4_ = auVar9._4_4_ * (float)(auVar102._4_4_ ^ uStack_75c);
      auVar40._0_4_ = auVar9._0_4_ * (float)(auVar102._0_4_ ^ local_760);
      auVar40._8_4_ = auVar9._8_4_ * (float)(auVar102._8_4_ ^ uStack_758);
      auVar40._12_4_ = auVar9._12_4_ * (float)(auVar102._12_4_ ^ uStack_754);
      auVar40._16_4_ = fStack_750 * 0.0;
      auVar40._20_4_ = fStack_74c * 0.0;
      auVar40._24_4_ = fStack_748 * 0.0;
      auVar40._28_4_ = uStack_744;
      auVar114 = vcmpps_avx(auVar248,auVar293,1);
      auVar114 = vorps_avx(auVar11,auVar114);
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar114 = vblendvps_avx(auVar40,auVar119,auVar114);
      _local_8c0 = vmaxps_avx(auVar121,auVar114);
      auVar114 = vcmpps_avx(auVar248,auVar293,6);
      auVar114 = vorps_avx(auVar11,auVar114);
      auVar120._8_4_ = 0x7f800000;
      auVar120._0_8_ = 0x7f8000007f800000;
      auVar120._12_4_ = 0x7f800000;
      auVar120._16_4_ = 0x7f800000;
      auVar120._20_4_ = 0x7f800000;
      auVar120._24_4_ = 0x7f800000;
      auVar120._28_4_ = 0x7f800000;
      auVar114 = vblendvps_avx(auVar40,auVar120,auVar114);
      auVar218 = vandps_avx(auVar218,local_280);
      auVar221 = ZEXT3264(auVar218);
      local_2e0 = vminps_avx(auVar268,auVar114);
      auVar114 = vcmpps_avx(_local_8c0,local_2e0,2);
      auVar11 = auVar218 & auVar114;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar11 = vminps_avx(local_660,auVar176);
        auVar55 = ZEXT412(0);
        auVar296 = ZEXT1264(auVar55) << 0x20;
        auVar11 = vmaxps_avx(auVar11,ZEXT1232(auVar55) << 0x20);
        auVar121 = vminps_avx(local_680,auVar176);
        auVar121 = vmaxps_avx(auVar121,ZEXT1232(auVar55) << 0x20);
        auVar41._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar11._28_4_ + 7.0;
        auVar9 = vfmadd213ps_fma(auVar41,local_800,local_a80);
        auVar42._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar121._28_4_ + 7.0;
        auVar102 = vfmadd213ps_fma(auVar42,local_800,local_a80);
        auVar11 = vminps_avx(auVar236,local_820);
        auVar121 = vminps_avx(local_840,auVar18);
        auVar11 = vminps_avx(auVar11,auVar121);
        auVar237 = vsubps_avx(auVar11,auVar237);
        auVar218 = vandps_avx(auVar114,auVar218);
        local_660 = ZEXT1632(auVar9);
        local_680 = ZEXT1632(auVar102);
        auVar43._4_4_ = auVar237._4_4_ * 0.99999976;
        auVar43._0_4_ = auVar237._0_4_ * 0.99999976;
        auVar43._8_4_ = auVar237._8_4_ * 0.99999976;
        auVar43._12_4_ = auVar237._12_4_ * 0.99999976;
        auVar43._16_4_ = auVar237._16_4_ * 0.99999976;
        auVar43._20_4_ = auVar237._20_4_ * 0.99999976;
        auVar43._24_4_ = auVar237._24_4_ * 0.99999976;
        auVar43._28_4_ = auVar237._28_4_;
        auVar237 = vmaxps_avx(ZEXT832(0) << 0x20,auVar43);
        auVar44._4_4_ = auVar237._4_4_ * auVar237._4_4_;
        auVar44._0_4_ = auVar237._0_4_ * auVar237._0_4_;
        auVar44._8_4_ = auVar237._8_4_ * auVar237._8_4_;
        auVar44._12_4_ = auVar237._12_4_ * auVar237._12_4_;
        auVar44._16_4_ = auVar237._16_4_ * auVar237._16_4_;
        auVar44._20_4_ = auVar237._20_4_ * auVar237._20_4_;
        auVar44._24_4_ = auVar237._24_4_ * auVar237._24_4_;
        auVar44._28_4_ = auVar237._28_4_;
        auVar114 = vsubps_avx(local_880,auVar44);
        auVar45._4_4_ = auVar114._4_4_ * fVar225 * 4.0;
        auVar45._0_4_ = auVar114._0_4_ * fVar223 * 4.0;
        auVar45._8_4_ = auVar114._8_4_ * fVar227 * 4.0;
        auVar45._12_4_ = auVar114._12_4_ * fVar129 * 4.0;
        auVar45._16_4_ = auVar114._16_4_ * fVar131 * 4.0;
        auVar45._20_4_ = auVar114._20_4_ * fVar132 * 4.0;
        auVar45._24_4_ = auVar114._24_4_ * fVar133 * 4.0;
        auVar45._28_4_ = auVar237._28_4_;
        auVar11 = vsubps_avx(auVar32,auVar45);
        auVar287 = ZEXT3264(auVar11);
        auVar121 = SUB6432(ZEXT864(0),0) << 0x20;
        local_940 = ZEXT832(0) << 0x20;
        auVar237 = vcmpps_avx(auVar11,ZEXT1232(auVar55) << 0x20,5);
        if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar237 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar237 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar237 >> 0x7f,0) == '\0') &&
              (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar237 >> 0xbf,0) == '\0') &&
            (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar237[0x1f]) {
          _local_960 = ZEXT832(0) << 0x20;
          auVar151 = ZEXT832(0) << 0x20;
          auVar184 = ZEXT864(0) << 0x20;
          auVar249._8_4_ = 0x7f800000;
          auVar249._0_8_ = 0x7f8000007f800000;
          auVar249._12_4_ = 0x7f800000;
          auVar249._16_4_ = 0x7f800000;
          auVar249._20_4_ = 0x7f800000;
          auVar249._24_4_ = 0x7f800000;
          auVar249._28_4_ = 0x7f800000;
          auVar257._8_4_ = 0xff800000;
          auVar257._0_8_ = 0xff800000ff800000;
          auVar257._12_4_ = 0xff800000;
          auVar257._16_4_ = 0xff800000;
          auVar257._20_4_ = 0xff800000;
          auVar257._24_4_ = 0xff800000;
          auVar257._28_4_ = 0xff800000;
          _local_920 = local_940;
        }
        else {
          auVar268 = vsqrtps_avx(auVar11);
          auVar258._0_4_ = fVar223 + fVar223;
          auVar258._4_4_ = fVar225 + fVar225;
          auVar258._8_4_ = fVar227 + fVar227;
          auVar258._12_4_ = fVar129 + fVar129;
          auVar258._16_4_ = fVar131 + fVar131;
          auVar258._20_4_ = fVar132 + fVar132;
          auVar258._24_4_ = fVar133 + fVar133;
          auVar258._28_4_ = fVar288 + fVar288;
          auVar121 = vrcpps_avx(auVar258);
          auVar9 = vfnmadd213ps_fma(auVar258,auVar121,auVar176);
          auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar121,auVar121);
          auVar294._0_4_ = (uint)auVar174._0_4_ ^ local_760;
          auVar294._4_4_ = (uint)auVar174._4_4_ ^ uStack_75c;
          auVar294._8_4_ = (uint)auVar174._8_4_ ^ uStack_758;
          auVar294._12_4_ = (uint)auVar174._12_4_ ^ uStack_754;
          auVar294._16_4_ = (uint)auVar174._16_4_ ^ (uint)fStack_750;
          auVar294._20_4_ = (uint)auVar174._20_4_ ^ (uint)fStack_74c;
          auVar294._24_4_ = (uint)auVar174._24_4_ ^ (uint)fStack_748;
          auVar294._28_4_ = (uint)auVar174._28_4_ ^ uStack_744;
          auVar121 = vsubps_avx(auVar294,auVar268);
          auVar17 = vsubps_avx(auVar268,auVar174);
          fVar208 = auVar121._0_4_ * auVar9._0_4_;
          fVar224 = auVar121._4_4_ * auVar9._4_4_;
          auVar46._4_4_ = fVar224;
          auVar46._0_4_ = fVar208;
          fVar223 = auVar121._8_4_ * auVar9._8_4_;
          auVar46._8_4_ = fVar223;
          fVar251 = auVar121._12_4_ * auVar9._12_4_;
          auVar46._12_4_ = fVar251;
          fVar225 = auVar121._16_4_ * 0.0;
          auVar46._16_4_ = fVar225;
          fVar252 = auVar121._20_4_ * 0.0;
          auVar46._20_4_ = fVar252;
          fVar227 = auVar121._24_4_ * 0.0;
          auVar46._24_4_ = fVar227;
          auVar46._28_4_ = auVar268._28_4_;
          fVar289 = auVar17._0_4_ * auVar9._0_4_;
          fVar297 = auVar17._4_4_ * auVar9._4_4_;
          auVar47._4_4_ = fVar297;
          auVar47._0_4_ = fVar289;
          fVar99 = auVar17._8_4_ * auVar9._8_4_;
          auVar47._8_4_ = fVar99;
          fVar129 = auVar17._12_4_ * auVar9._12_4_;
          auVar47._12_4_ = fVar129;
          fVar131 = auVar17._16_4_ * 0.0;
          auVar47._16_4_ = fVar131;
          fVar132 = auVar17._20_4_ * 0.0;
          auVar47._20_4_ = fVar132;
          fVar133 = auVar17._24_4_ * 0.0;
          auVar47._24_4_ = fVar133;
          auVar47._28_4_ = auVar121._28_4_;
          auVar296 = ZEXT3264(auVar47);
          auVar9 = vfmadd213ps_fma(auVar279,auVar46,auVar306);
          auVar102 = vfmadd213ps_fma(auVar279,auVar47,auVar306);
          auVar121 = ZEXT1632(CONCAT412(fVar263 * auVar9._12_4_,
                                        CONCAT48(fVar262 * auVar9._8_4_,
                                                 CONCAT44(fVar226 * auVar9._4_4_,
                                                          fVar222 * auVar9._0_4_))));
          auVar268 = ZEXT1632(CONCAT412(fVar263 * auVar102._12_4_,
                                        CONCAT48(fVar262 * auVar102._8_4_,
                                                 CONCAT44(fVar226 * auVar102._4_4_,
                                                          fVar222 * auVar102._0_4_))));
          auVar9 = vfmadd213ps_fma(auVar13,auVar121,auVar116);
          auVar102 = vfmadd213ps_fma(auVar13,auVar268,auVar116);
          auVar109 = vfmadd213ps_fma(auVar14,auVar121,auVar204);
          auVar137 = vfmadd213ps_fma(auVar14,auVar268,auVar204);
          auVar101 = vfmadd213ps_fma(auVar121,auVar151,auVar298);
          auVar138 = vfmadd213ps_fma(auVar151,auVar268,auVar298);
          auVar48._4_4_ = fVar98 * fVar224;
          auVar48._0_4_ = fVar98 * fVar208;
          auVar48._8_4_ = fVar98 * fVar223;
          auVar48._12_4_ = fVar98 * fVar251;
          auVar48._16_4_ = fVar98 * fVar225;
          auVar48._20_4_ = fVar98 * fVar252;
          auVar48._24_4_ = fVar98 * fVar227;
          auVar48._28_4_ = 0;
          auVar121 = vsubps_avx(auVar48,ZEXT1632(auVar9));
          auVar49._4_4_ = (float)local_8e0._4_4_ * fVar224;
          auVar49._0_4_ = (float)local_8e0._0_4_ * fVar208;
          auVar49._8_4_ = fStack_8d8 * fVar223;
          auVar49._12_4_ = fStack_8d4 * fVar251;
          auVar49._16_4_ = fStack_8d0 * fVar225;
          auVar49._20_4_ = fStack_8cc * fVar252;
          auVar49._24_4_ = fStack_8c8 * fVar227;
          auVar49._28_4_ = fVar288;
          auVar151 = vsubps_avx(auVar49,ZEXT1632(auVar109));
          auVar177._0_4_ = (float)local_a60._0_4_ * fVar208;
          auVar177._4_4_ = (float)local_a60._4_4_ * fVar224;
          auVar177._8_4_ = fStack_a58 * fVar223;
          auVar177._12_4_ = fStack_a54 * fVar251;
          auVar177._16_4_ = fStack_a50 * fVar225;
          auVar177._20_4_ = fStack_a4c * fVar252;
          auVar177._24_4_ = fStack_a48 * fVar227;
          auVar177._28_4_ = 0;
          auVar13 = vsubps_avx(auVar177,ZEXT1632(auVar101));
          auVar184 = ZEXT3264(auVar13);
          auVar259._0_4_ = fVar98 * fVar289;
          auVar259._4_4_ = fVar98 * fVar297;
          auVar259._8_4_ = fVar98 * fVar99;
          auVar259._12_4_ = fVar98 * fVar129;
          auVar259._16_4_ = fVar98 * fVar131;
          auVar259._20_4_ = fVar98 * fVar132;
          auVar259._24_4_ = fVar98 * fVar133;
          auVar259._28_4_ = 0;
          _local_920 = vsubps_avx(auVar259,ZEXT1632(auVar102));
          auVar50._4_4_ = (float)local_8e0._4_4_ * fVar297;
          auVar50._0_4_ = (float)local_8e0._0_4_ * fVar289;
          auVar50._8_4_ = fStack_8d8 * fVar99;
          auVar50._12_4_ = fStack_8d4 * fVar129;
          auVar50._16_4_ = fStack_8d0 * fVar131;
          auVar50._20_4_ = fStack_8cc * fVar132;
          auVar50._24_4_ = fStack_8c8 * fVar133;
          auVar50._28_4_ = local_920._28_4_;
          local_940 = vsubps_avx(auVar50,ZEXT1632(auVar137));
          auVar51._4_4_ = (float)local_a60._4_4_ * fVar297;
          auVar51._0_4_ = (float)local_a60._0_4_ * fVar289;
          auVar51._8_4_ = fStack_a58 * fVar99;
          auVar51._12_4_ = fStack_a54 * fVar129;
          auVar51._16_4_ = fStack_a50 * fVar131;
          auVar51._20_4_ = fStack_a4c * fVar132;
          auVar51._24_4_ = fStack_a48 * fVar133;
          auVar51._28_4_ = local_940._28_4_;
          _local_960 = vsubps_avx(auVar51,ZEXT1632(auVar138));
          auVar13 = vcmpps_avx(auVar11,_DAT_02020f00,5);
          auVar260._8_4_ = 0x7f800000;
          auVar260._0_8_ = 0x7f8000007f800000;
          auVar260._12_4_ = 0x7f800000;
          auVar260._16_4_ = 0x7f800000;
          auVar260._20_4_ = 0x7f800000;
          auVar260._24_4_ = 0x7f800000;
          auVar260._28_4_ = 0x7f800000;
          auVar249 = vblendvps_avx(auVar260,auVar46,auVar13);
          auVar68._4_4_ = uStack_8fc;
          auVar68._0_4_ = local_900;
          auVar68._8_4_ = uStack_8f8;
          auVar68._12_4_ = uStack_8f4;
          auVar68._16_4_ = uStack_8f0;
          auVar68._20_4_ = uStack_8ec;
          auVar68._24_4_ = uStack_8e8;
          auVar68._28_4_ = uStack_8e4;
          auVar11 = vandps_avx(auVar68,auVar19);
          auVar11 = vmaxps_avx(local_5c0,auVar11);
          auVar287 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar52._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar52._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar52._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar52._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar52._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar52._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar52._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar52._28_4_ = auVar11._28_4_;
          auVar11 = vandps_avx(auVar68,auVar15);
          auVar11 = vcmpps_avx(auVar11,auVar52,1);
          auVar280 = ZEXT3264(auVar11);
          auVar261._8_4_ = 0xff800000;
          auVar261._0_8_ = 0xff800000ff800000;
          auVar261._12_4_ = 0xff800000;
          auVar261._16_4_ = 0xff800000;
          auVar261._20_4_ = 0xff800000;
          auVar261._24_4_ = 0xff800000;
          auVar261._28_4_ = 0xff800000;
          auVar257 = vblendvps_avx(auVar261,auVar47,auVar13);
          auVar14 = auVar13 & auVar11;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar237 = vandps_avx(auVar11,auVar13);
            auVar11 = vcmpps_avx(auVar114,_DAT_02020f00,2);
            auVar295._8_4_ = 0xff800000;
            auVar295._0_8_ = 0xff800000ff800000;
            auVar295._12_4_ = 0xff800000;
            auVar295._16_4_ = 0xff800000;
            auVar295._20_4_ = 0xff800000;
            auVar295._24_4_ = 0xff800000;
            auVar295._28_4_ = 0xff800000;
            auVar296 = ZEXT3264(auVar295);
            auVar302._8_4_ = 0x7f800000;
            auVar302._0_8_ = 0x7f8000007f800000;
            auVar302._12_4_ = 0x7f800000;
            auVar302._16_4_ = 0x7f800000;
            auVar302._20_4_ = 0x7f800000;
            auVar302._24_4_ = 0x7f800000;
            auVar302._28_4_ = 0x7f800000;
            auVar114 = vblendvps_avx(auVar302,auVar295,auVar11);
            auVar9 = vpackssdw_avx(auVar237._0_16_,auVar237._16_16_);
            auVar14 = vpmovsxwd_avx2(auVar9);
            auVar280 = ZEXT3264(auVar14);
            auVar249 = vblendvps_avx(auVar249,auVar114,auVar14);
            auVar114 = vblendvps_avx(auVar295,auVar302,auVar11);
            auVar287 = ZEXT3264(auVar114);
            auVar257 = vblendvps_avx(auVar257,auVar114,auVar14);
            auVar238._0_8_ = auVar237._0_8_ ^ 0xffffffffffffffff;
            auVar238._8_4_ = auVar237._8_4_ ^ 0xffffffff;
            auVar238._12_4_ = auVar237._12_4_ ^ 0xffffffff;
            auVar238._16_4_ = auVar237._16_4_ ^ 0xffffffff;
            auVar238._20_4_ = auVar237._20_4_ ^ 0xffffffff;
            auVar238._24_4_ = auVar237._24_4_ ^ 0xffffffff;
            auVar238._28_4_ = auVar237._28_4_ ^ 0xffffffff;
            auVar237 = vorps_avx(auVar11,auVar238);
            auVar237 = vandps_avx(auVar13,auVar237);
          }
        }
        auVar305 = local_a60._0_28_;
        auVar269 = ZEXT3264(_local_8c0);
        local_460 = _local_8c0;
        local_440 = vminps_avx(local_2e0,auVar249);
        _local_6c0 = vmaxps_avx(_local_8c0,auVar257);
        auVar250 = ZEXT3264(_local_6c0);
        _local_300 = _local_6c0;
        auVar114 = vcmpps_avx(_local_8c0,local_440,2);
        local_7a0 = vandps_avx(auVar114,auVar218);
        auVar114 = vcmpps_avx(_local_6c0,local_2e0,2);
        local_740 = vandps_avx(auVar114,auVar218);
        auVar221 = ZEXT3264(local_740);
        auVar218 = vorps_avx(local_740,local_7a0);
        if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar218 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar218 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar218 >> 0x7f,0) != '\0') ||
              (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar218 >> 0xbf,0) != '\0') ||
            (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar218[0x1f] < '\0') {
          local_700._0_8_ = auVar237._0_8_ ^ 0xffffffffffffffff;
          local_700._8_4_ = auVar237._8_4_ ^ 0xffffffff;
          local_700._12_4_ = auVar237._12_4_ ^ 0xffffffff;
          local_700._16_4_ = auVar237._16_4_ ^ 0xffffffff;
          local_700._20_4_ = auVar237._20_4_ ^ 0xffffffff;
          local_700._24_4_ = auVar237._24_4_ ^ 0xffffffff;
          local_700._28_4_ = auVar237._28_4_ ^ 0xffffffff;
          auVar221._0_4_ = (float)local_a60._0_4_ * auVar184._0_4_;
          auVar221._4_4_ = (float)local_a60._4_4_ * auVar184._4_4_;
          auVar221._8_4_ = fStack_a58 * auVar184._8_4_;
          auVar221._12_4_ = fStack_a54 * auVar184._12_4_;
          auVar221._16_4_ = fStack_a50 * auVar184._16_4_;
          auVar221._20_4_ = fStack_a4c * auVar184._20_4_;
          auVar221._28_36_ = auVar184._28_36_;
          auVar221._24_4_ = fStack_a48 * auVar184._24_4_;
          auVar9 = vfmadd132ps_fma(auVar151,auVar221._0_32_,_local_8e0);
          auVar9 = vfmadd213ps_fma(auVar121,auVar278,ZEXT1632(auVar9));
          auVar69._4_4_ = uStack_8fc;
          auVar69._0_4_ = local_900;
          auVar69._8_4_ = uStack_8f8;
          auVar69._12_4_ = uStack_8f4;
          auVar69._16_4_ = uStack_8f0;
          auVar69._20_4_ = uStack_8ec;
          auVar69._24_4_ = uStack_8e8;
          auVar69._28_4_ = uStack_8e4;
          auVar218 = vandps_avx(ZEXT1632(auVar9),auVar69);
          auVar153._8_4_ = 0x3e99999a;
          auVar153._0_8_ = 0x3e99999a3e99999a;
          auVar153._12_4_ = 0x3e99999a;
          auVar153._16_4_ = 0x3e99999a;
          auVar153._20_4_ = 0x3e99999a;
          auVar153._24_4_ = 0x3e99999a;
          auVar153._28_4_ = 0x3e99999a;
          auVar218 = vcmpps_avx(auVar218,auVar153,1);
          auVar218 = vorps_avx(auVar218,local_700);
          auVar154._8_4_ = 3;
          auVar154._0_8_ = 0x300000003;
          auVar154._12_4_ = 3;
          auVar154._16_4_ = 3;
          auVar154._20_4_ = 3;
          auVar154._24_4_ = 3;
          auVar154._28_4_ = 3;
          auVar179._8_4_ = 2;
          auVar179._0_8_ = 0x200000002;
          auVar179._12_4_ = 2;
          auVar179._16_4_ = 2;
          auVar179._20_4_ = 2;
          auVar179._24_4_ = 2;
          auVar179._28_4_ = 2;
          auVar218 = vblendvps_avx(auVar179,auVar154,auVar218);
          uVar95 = (undefined4)uVar97;
          local_2c0._4_4_ = uVar95;
          local_2c0._0_4_ = uVar95;
          local_2c0._8_4_ = uVar95;
          local_2c0._12_4_ = uVar95;
          local_2c0._16_4_ = uVar95;
          local_2c0._20_4_ = uVar95;
          local_2c0._24_4_ = uVar95;
          local_2c0._28_4_ = uVar95;
          local_6a0 = vpcmpgtd_avx2(auVar218,local_2c0);
          local_720 = vpandn_avx2(local_6a0,local_7a0);
          auVar221 = ZEXT3264(local_720);
          auVar218 = local_7a0 & ~local_6a0;
          auStack_778 = auVar32._8_24_;
          local_780 = uVar97;
          fStack_b7c = auVar8._4_4_;
          fStack_b78 = auVar8._8_4_;
          fStack_b74 = auVar8._12_4_;
          local_6e0 = local_740;
          if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar218 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar218 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar218 >> 0x7f,0) != '\0') ||
                (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar218 >> 0xbf,0) != '\0') ||
              (auVar218 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar218[0x1f] < '\0') {
            auVar102 = vminps_avx(auVar10,auVar103);
            auVar9 = vmaxps_avx(auVar10,auVar103);
            auVar109 = vminps_avx(auVar7,auVar8);
            auVar137 = vminps_avx(auVar102,auVar109);
            auVar102 = vmaxps_avx(auVar7,auVar8);
            auVar109 = vmaxps_avx(auVar9,auVar102);
            auVar9 = vandps_avx(auVar137,auVar243);
            auVar102 = vandps_avx(auVar109,auVar243);
            auVar9 = vmaxps_avx(auVar9,auVar102);
            auVar102 = vmovshdup_avx(auVar9);
            auVar102 = vmaxss_avx(auVar102,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar102);
            local_9e0._0_4_ = auVar9._0_4_ * 1.9073486e-06;
            local_860 = vshufps_avx(auVar109,auVar109,0xff);
            local_8a0._4_4_ = (float)local_8c0._4_4_ + fVar130;
            local_8a0._0_4_ = (float)local_8c0._0_4_ + fVar130;
            fStack_898 = fStack_8b8 + fVar130;
            fStack_894 = fStack_8b4 + fVar130;
            fStack_890 = fStack_8b0 + fVar130;
            fStack_88c = fStack_8ac + fVar130;
            fStack_888 = fStack_8a8 + fVar130;
            fStack_884 = fStack_8a4 + fVar130;
            do {
              auVar155._8_4_ = 0x7f800000;
              auVar155._0_8_ = 0x7f8000007f800000;
              auVar155._12_4_ = 0x7f800000;
              auVar155._16_4_ = 0x7f800000;
              auVar155._20_4_ = 0x7f800000;
              auVar155._24_4_ = 0x7f800000;
              auVar155._28_4_ = 0x7f800000;
              auVar218 = auVar221._0_32_;
              auVar237 = vblendvps_avx(auVar155,_local_8c0,auVar218);
              auVar114 = vshufps_avx(auVar237,auVar237,0xb1);
              auVar114 = vminps_avx(auVar237,auVar114);
              auVar11 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar11);
              auVar11 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar11);
              auVar237 = vcmpps_avx(auVar237,auVar114,0);
              auVar114 = auVar218 & auVar237;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar218 = vandps_avx(auVar237,auVar218);
              }
              local_880._0_8_ = uVar92;
              uVar94 = vmovmskps_avx(auVar218);
              iVar88 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar88 = iVar88 + 1;
              }
              uVar89 = iVar88 << 2;
              *(undefined4 *)(local_720 + uVar89) = 0;
              uVar94 = *(uint *)(local_660 + uVar89);
              fVar288 = *(float *)(local_460 + uVar89);
              fVar208 = auVar5._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                auVar280 = ZEXT1664(auVar280._0_16_);
                fVar208 = sqrtf((float)local_a20._0_4_);
              }
              auVar269 = ZEXT464(uVar94);
              local_7e0._0_4_ = fVar208 * 1.9073486e-06;
              lVar93 = 5;
              do {
                fVar251 = auVar269._0_4_;
                fVar223 = 1.0 - fVar251;
                fVar226 = fVar223 * fVar223 * fVar223;
                fVar224 = fVar251 * fVar251 * fVar251;
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar226),
                                           ZEXT416((uint)fVar224));
                fVar208 = fVar251 * fVar223;
                auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar208 * 6.0)),
                                           ZEXT416((uint)(fVar223 * fVar208)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar137 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar208 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar251 * fVar208)));
                auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar224),
                                         ZEXT416((uint)fVar226));
                fVar222 = (auVar9._0_4_ + auVar137._0_4_) * 0.16666667;
                fVar224 = fVar224 * 0.16666667;
                auVar139._0_4_ = fVar224 * fVar188;
                auVar139._4_4_ = fVar224 * fStack_b7c;
                auVar139._8_4_ = fVar224 * fStack_b78;
                auVar139._12_4_ = fVar224 * fStack_b74;
                auVar190._4_4_ = fVar222;
                auVar190._0_4_ = fVar222;
                auVar190._8_4_ = fVar222;
                auVar190._12_4_ = fVar222;
                auVar9 = vfmadd132ps_fma(auVar190,auVar139,auVar7);
                fVar222 = (auVar102._0_4_ + auVar109._0_4_) * 0.16666667;
                auVar140._4_4_ = fVar222;
                auVar140._0_4_ = fVar222;
                auVar140._8_4_ = fVar222;
                auVar140._12_4_ = fVar222;
                auVar9 = vfmadd132ps_fma(auVar140,auVar9,auVar103);
                auVar165._4_4_ = fVar288;
                auVar165._0_4_ = fVar288;
                auVar165._8_4_ = fVar288;
                auVar165._12_4_ = fVar288;
                auVar102 = vfmadd213ps_fma(auVar165,local_a10,_DAT_01feba10);
                fVar226 = fVar226 * 0.16666667;
                auVar104._4_4_ = fVar226;
                auVar104._0_4_ = fVar226;
                auVar104._8_4_ = fVar226;
                auVar104._12_4_ = fVar226;
                auVar9 = vfmadd132ps_fma(auVar104,auVar9,auVar10);
                local_7c0._0_16_ = auVar9;
                auVar9 = vsubps_avx(auVar102,auVar9);
                _local_a00 = auVar9;
                auVar9 = vdpps_avx(auVar9,auVar9,0x7f);
                fVar222 = auVar9._0_4_;
                auVar102 = auVar269._0_16_;
                if (fVar222 < 0.0) {
                  auVar280 = ZEXT1664(auVar280._0_16_);
                  auVar250._0_4_ = sqrtf(fVar222);
                  auVar250._4_60_ = extraout_var;
                  auVar109 = auVar250._0_16_;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar9,auVar9);
                }
                auVar189 = ZEXT416((uint)fVar223);
                auVar105._4_4_ = fVar223;
                auVar105._0_4_ = fVar223;
                auVar105._8_4_ = fVar223;
                auVar105._12_4_ = fVar223;
                auVar101 = vfnmsub213ss_fma(auVar102,auVar102,ZEXT416((uint)(fVar208 * 4.0)));
                auVar137 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * 4.0)),auVar189,auVar189);
                fVar208 = fVar223 * -fVar223 * 0.5;
                fVar224 = auVar101._0_4_ * 0.5;
                fVar226 = auVar137._0_4_ * 0.5;
                fVar223 = fVar251 * fVar251 * 0.5;
                auVar232._0_4_ = fVar188 * fVar223;
                auVar232._4_4_ = fStack_b7c * fVar223;
                auVar232._8_4_ = fStack_b78 * fVar223;
                auVar232._12_4_ = fStack_b74 * fVar223;
                auVar191._4_4_ = fVar226;
                auVar191._0_4_ = fVar226;
                auVar191._8_4_ = fVar226;
                auVar191._12_4_ = fVar226;
                auVar137 = vfmadd213ps_fma(auVar191,auVar7,auVar232);
                auVar210._4_4_ = fVar224;
                auVar210._0_4_ = fVar224;
                auVar210._8_4_ = fVar224;
                auVar210._12_4_ = fVar224;
                auVar137 = vfmadd213ps_fma(auVar210,auVar103,auVar137);
                auVar284._4_4_ = fVar208;
                auVar284._0_4_ = fVar208;
                auVar284._8_4_ = fVar208;
                auVar284._12_4_ = fVar208;
                auVar138 = vfmadd213ps_fma(auVar284,auVar10,auVar137);
                auVar137 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar189,auVar102);
                auVar102 = vfmadd231ss_fma(auVar189,auVar102,SUB6416(ZEXT464(0xc0000000),0));
                auVar192._0_4_ = fVar188 * fVar251;
                auVar192._4_4_ = fStack_b7c * fVar251;
                auVar192._8_4_ = fStack_b78 * fVar251;
                auVar192._12_4_ = fStack_b74 * fVar251;
                uVar95 = auVar102._0_4_;
                auVar211._4_4_ = uVar95;
                auVar211._0_4_ = uVar95;
                auVar211._8_4_ = uVar95;
                auVar211._12_4_ = uVar95;
                auVar102 = vfmadd213ps_fma(auVar211,auVar7,auVar192);
                auVar166._0_4_ = auVar137._0_4_;
                auVar166._4_4_ = auVar166._0_4_;
                auVar166._8_4_ = auVar166._0_4_;
                auVar166._12_4_ = auVar166._0_4_;
                auVar102 = vfmadd213ps_fma(auVar166,auVar103,auVar102);
                auVar189 = vfmadd231ps_fma(auVar102,auVar10,auVar105);
                auVar137 = vdpps_avx(auVar138,auVar138,0x7f);
                auVar102 = vblendps_avx(auVar137,_DAT_01feba10,0xe);
                auVar101 = vrsqrtss_avx(auVar102,auVar102);
                fVar208 = auVar101._0_4_;
                fVar226 = auVar137._0_4_;
                fVar208 = fVar208 * 1.5 + fVar226 * -0.5 * fVar208 * fVar208 * fVar208;
                auVar101 = vdpps_avx(auVar138,auVar189,0x7f);
                auVar167._0_4_ = auVar189._0_4_ * fVar226;
                auVar167._4_4_ = auVar189._4_4_ * fVar226;
                auVar167._8_4_ = auVar189._8_4_ * fVar226;
                auVar167._12_4_ = auVar189._12_4_ * fVar226;
                fVar224 = auVar101._0_4_;
                auVar233._0_4_ = auVar138._0_4_ * fVar224;
                auVar233._4_4_ = auVar138._4_4_ * fVar224;
                fVar223 = auVar138._8_4_;
                auVar233._8_4_ = fVar223 * fVar224;
                fVar262 = auVar138._12_4_;
                auVar233._12_4_ = fVar262 * fVar224;
                auVar101 = vsubps_avx(auVar167,auVar233);
                auVar102 = vrcpss_avx(auVar102,auVar102);
                auVar189 = vfnmadd213ss_fma(auVar102,auVar137,ZEXT416(0x40000000));
                fVar224 = auVar102._0_4_ * auVar189._0_4_;
                auVar102 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(fVar288 * (float)local_7e0._0_4_)));
                auVar221 = ZEXT1664(auVar102);
                local_a40._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
                local_a40._8_4_ = -fVar223;
                local_a40._12_4_ = -fVar262;
                auVar193._0_4_ = fVar208 * auVar101._0_4_ * fVar224;
                auVar193._4_4_ = fVar208 * auVar101._4_4_ * fVar224;
                auVar193._8_4_ = fVar208 * auVar101._8_4_ * fVar224;
                auVar193._12_4_ = fVar208 * auVar101._12_4_ * fVar224;
                auVar240._0_4_ = auVar138._0_4_ * fVar208;
                auVar240._4_4_ = auVar138._4_4_ * fVar208;
                auVar240._8_4_ = fVar223 * fVar208;
                auVar240._12_4_ = fVar262 * fVar208;
                if (fVar226 < -fVar226) {
                  local_a80._0_16_ = auVar193;
                  auVar280 = ZEXT1664(auVar280._0_16_);
                  fVar208 = sqrtf(fVar226);
                  auVar221 = ZEXT464(auVar102._0_4_);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar193 = local_a80._0_16_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar137,auVar137);
                  fVar208 = auVar137._0_4_;
                }
                auVar137 = vdpps_avx(_local_a00,auVar240,0x7f);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)local_9e0._0_4_),auVar109,auVar221._0_16_);
                auVar101 = vdpps_avx(local_a40._0_16_,auVar240,0x7f);
                auVar189 = vdpps_avx(_local_a00,auVar193,0x7f);
                auVar145 = vdpps_avx(local_a10,auVar240,0x7f);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)(auVar109._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_9e0._0_4_ / fVar208)),
                                           auVar100);
                auVar296 = ZEXT1664(auVar100);
                fVar208 = auVar101._0_4_ + auVar189._0_4_;
                auVar106._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                auVar106._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                auVar106._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                auVar106._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                auVar109 = vdpps_avx(_local_a00,local_a40._0_16_,0x7f);
                auVar189 = vsubps_avx(auVar9,auVar106);
                auVar101 = vrsqrtss_avx(auVar189,auVar189);
                fVar226 = auVar189._0_4_;
                fVar224 = auVar101._0_4_;
                fVar224 = fVar224 * 1.5 + fVar226 * -0.5 * fVar224 * fVar224 * fVar224;
                auVar101 = vdpps_avx(_local_a00,local_a10,0x7f);
                local_a40._0_16_ = vfnmadd231ss_fma(auVar109,auVar137,ZEXT416((uint)fVar208));
                auVar109 = vfnmadd231ss_fma(auVar101,auVar137,auVar145);
                if (fVar226 < 0.0) {
                  local_a80._0_4_ = auVar100._0_4_;
                  local_800._0_16_ = ZEXT416((uint)fVar208);
                  local_820._0_4_ = fVar224;
                  local_840._0_16_ = auVar109;
                  auVar280 = ZEXT1664(auVar280._0_16_);
                  fVar226 = sqrtf(fVar226);
                  auVar296 = ZEXT464((uint)local_a80._0_4_);
                  auVar221 = ZEXT464(auVar102._0_4_);
                  fVar224 = (float)local_820._0_4_;
                  auVar109 = local_840._0_16_;
                  auVar102 = local_800._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar189,auVar189);
                  fVar226 = auVar102._0_4_;
                  auVar102 = ZEXT416((uint)fVar208);
                }
                auVar287 = ZEXT1664(auVar137);
                auVar250 = ZEXT1664(auVar138);
                auVar101 = vpermilps_avx(local_7c0._0_16_,0xff);
                auVar189 = vshufps_avx(auVar138,auVar138,0xff);
                auVar100 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar224),auVar189);
                auVar194._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar194._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar212._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar212._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar212._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar109 = ZEXT416((uint)(auVar109._0_4_ * fVar224));
                auVar145 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * auVar145._0_4_)),auVar102
                                           ,auVar109);
                auVar109 = vinsertps_avx(auVar109,auVar194,0x10);
                uVar95 = auVar145._0_4_;
                auVar195._4_4_ = uVar95;
                auVar195._0_4_ = uVar95;
                auVar195._8_4_ = uVar95;
                auVar195._12_4_ = uVar95;
                auVar109 = vdivps_avx(auVar109,auVar195);
                auVar145 = ZEXT416((uint)(fVar226 - auVar101._0_4_));
                auVar101 = vinsertps_avx(auVar137,auVar145,0x10);
                auVar168._0_4_ = auVar101._0_4_ * auVar109._0_4_;
                auVar168._4_4_ = auVar101._4_4_ * auVar109._4_4_;
                auVar168._8_4_ = auVar101._8_4_ * auVar109._8_4_;
                auVar168._12_4_ = auVar101._12_4_ * auVar109._12_4_;
                auVar102 = vinsertps_avx(auVar212,auVar102,0x1c);
                auVar102 = vdivps_avx(auVar102,auVar195);
                auVar109 = vhaddps_avx(auVar168,auVar168);
                auVar196._0_4_ = auVar101._0_4_ * auVar102._0_4_;
                auVar196._4_4_ = auVar101._4_4_ * auVar102._4_4_;
                auVar196._8_4_ = auVar101._8_4_ * auVar102._8_4_;
                auVar196._12_4_ = auVar101._12_4_ * auVar102._12_4_;
                auVar102 = vhaddps_avx(auVar196,auVar196);
                fVar251 = fVar251 - auVar109._0_4_;
                fVar288 = fVar288 - auVar102._0_4_;
                auVar102 = vandps_avx(auVar137,auVar243);
                bVar53 = true;
                auVar305 = local_a60._0_28_;
                if (auVar102._0_4_ < auVar296._0_4_) {
                  auVar109 = vfmadd231ss_fma(ZEXT416((uint)(auVar221._0_4_ + auVar296._0_4_)),
                                             local_860,ZEXT416(0x36000000));
                  auVar102 = vandps_avx(auVar145,auVar243);
                  if (auVar102._0_4_ < auVar109._0_4_) {
                    fVar288 = fVar288 + (float)local_9a0._0_4_;
                    if (fVar128 <= fVar288) {
                      fVar208 = *(float *)(ray + k * 4 + 0x100);
                      auVar287 = ZEXT464((uint)fVar208);
                      if (((fVar288 <= fVar208) && (0.0 <= fVar251)) && (fVar251 <= 1.0)) {
                        auVar9 = vrsqrtss_avx(auVar9,auVar9);
                        fVar224 = auVar9._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar91].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                          unaff_BL = 0;
                        }
                        else {
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            fVar222 = fVar224 * 1.5 + fVar222 * -0.5 * fVar224 * fVar224 * fVar224;
                            auVar141._0_4_ = fVar222 * (float)local_a00._0_4_;
                            auVar141._4_4_ = fVar222 * (float)local_a00._4_4_;
                            auVar141._8_4_ = fVar222 * fStack_9f8;
                            auVar141._12_4_ = fVar222 * fStack_9f4;
                            auVar137 = vfmadd213ps_fma(auVar189,auVar141,auVar138);
                            auVar9 = vshufps_avx(auVar141,auVar141,0xc9);
                            auVar102 = vshufps_avx(auVar138,auVar138,0xc9);
                            auVar142._0_4_ = auVar141._0_4_ * auVar102._0_4_;
                            auVar142._4_4_ = auVar141._4_4_ * auVar102._4_4_;
                            auVar142._8_4_ = auVar141._8_4_ * auVar102._8_4_;
                            auVar142._12_4_ = auVar141._12_4_ * auVar102._12_4_;
                            auVar109 = vfmsub231ps_fma(auVar142,auVar138,auVar9);
                            auVar9 = vshufps_avx(auVar109,auVar109,0xc9);
                            auVar102 = vshufps_avx(auVar137,auVar137,0xc9);
                            auVar109 = vshufps_avx(auVar109,auVar109,0xd2);
                            auVar107._0_4_ = auVar137._0_4_ * auVar109._0_4_;
                            auVar107._4_4_ = auVar137._4_4_ * auVar109._4_4_;
                            auVar107._8_4_ = auVar137._8_4_ * auVar109._8_4_;
                            auVar107._12_4_ = auVar137._12_4_ * auVar109._12_4_;
                            auVar102 = vfmsub231ps_fma(auVar107,auVar9,auVar102);
                            auVar156._4_4_ = fVar251;
                            auVar156._0_4_ = fVar251;
                            auVar156._8_4_ = fVar251;
                            auVar156._12_4_ = fVar251;
                            auVar156._16_4_ = fVar251;
                            auVar156._20_4_ = fVar251;
                            auVar156._24_4_ = fVar251;
                            auVar156._28_4_ = fVar251;
                            auVar9 = vmovshdup_avx(auVar102);
                            local_420._8_8_ = auVar9._0_8_;
                            auVar9 = vshufps_avx(auVar102,auVar102,0xaa);
                            local_400 = auVar9._0_8_;
                            local_3e0 = auVar102._0_4_;
                            local_420._0_8_ = local_420._8_8_;
                            local_420._16_8_ = local_420._8_8_;
                            local_420._24_8_ = local_420._8_8_;
                            uStack_3f8 = local_400;
                            uStack_3f0 = local_400;
                            uStack_3e8 = local_400;
                            uStack_3dc = local_3e0;
                            uStack_3d8 = local_3e0;
                            uStack_3d4 = local_3e0;
                            uStack_3d0 = local_3e0;
                            uStack_3cc = local_3e0;
                            uStack_3c8 = local_3e0;
                            uStack_3c4 = local_3e0;
                            local_3c0 = auVar156;
                            local_3a0 = ZEXT432(0) << 0x20;
                            local_380 = CONCAT44(uStack_5fc,local_600);
                            uStack_378 = CONCAT44(uStack_5f4,uStack_5f8);
                            uStack_370 = CONCAT44(uStack_5ec,uStack_5f0);
                            uStack_368 = CONCAT44(uStack_5e4,uStack_5e8);
                            local_360._4_4_ = uStack_5dc;
                            local_360._0_4_ = local_5e0;
                            local_360._8_4_ = uStack_5d8;
                            local_360._12_4_ = uStack_5d4;
                            local_360._16_4_ = uStack_5d0;
                            local_360._20_4_ = uStack_5cc;
                            local_360._24_4_ = uStack_5c8;
                            local_360._28_4_ = uStack_5c4;
                            vpcmpeqd_avx2(local_360,local_360);
                            local_340 = context->user->instID[0];
                            uStack_33c = local_340;
                            uStack_338 = local_340;
                            uStack_334 = local_340;
                            uStack_330 = local_340;
                            uStack_32c = local_340;
                            uStack_328 = local_340;
                            uStack_324 = local_340;
                            local_320 = context->user->instPrimID[0];
                            uStack_31c = local_320;
                            uStack_318 = local_320;
                            uStack_314 = local_320;
                            uStack_310 = local_320;
                            uStack_30c = local_320;
                            uStack_308 = local_320;
                            uStack_304 = local_320;
                            *(float *)(ray + k * 4 + 0x100) = fVar288;
                            local_9c0 = local_620._0_8_;
                            uStack_9b8 = local_620._8_8_;
                            uStack_9b0 = local_620._16_8_;
                            uStack_9a8 = local_620._24_8_;
                            local_ab0.valid = (int *)&local_9c0;
                            local_ab0.geometryUserPtr = pGVar3->userPtr;
                            local_ab0.context = context->user;
                            local_ab0.hit = (RTCHitN *)local_420;
                            local_ab0.N = 8;
                            local_ab0.ray = (RTCRayN *)ray;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar250 = ZEXT1664(auVar138);
                              auVar280 = ZEXT1664(auVar280._0_16_);
                              auVar296 = ZEXT1664(auVar296._0_16_);
                              (*pGVar3->occlusionFilterN)(&local_ab0);
                              auVar269._8_56_ = extraout_var_02;
                              auVar269._0_8_ = extraout_XMM1_Qa;
                              auVar156 = auVar269._0_32_;
                            }
                            auVar305 = local_a60._0_28_;
                            auVar62._8_8_ = uStack_9b8;
                            auVar62._0_8_ = local_9c0;
                            auVar62._16_8_ = uStack_9b0;
                            auVar62._24_8_ = uStack_9a8;
                            auVar237 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                     auVar62);
                            auVar114 = vpcmpeqd_avx2(auVar156,auVar156);
                            auVar218 = auVar114 & ~auVar237;
                            if ((((((((auVar218 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar218 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar218 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar218 >> 0x7f,0) == '\0') &&
                                  (auVar218 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar218 >> 0xbf,0) == '\0') &&
                                (auVar218 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar218[0x1f]) {
                              auVar237 = auVar237 ^ auVar114;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar250 = ZEXT1664(auVar250._0_16_);
                                auVar280 = ZEXT1664(auVar280._0_16_);
                                auVar296 = ZEXT1664(auVar296._0_16_);
                                (*p_Var4)(&local_ab0);
                                auVar305 = local_a60._0_28_;
                              }
                              auVar63._8_8_ = uStack_9b8;
                              auVar63._0_8_ = local_9c0;
                              auVar63._16_8_ = uStack_9b0;
                              auVar63._24_8_ = uStack_9a8;
                              auVar218 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                       auVar63);
                              auVar237 = auVar218 ^ _DAT_0205a980;
                              auVar180._8_4_ = 0xff800000;
                              auVar180._0_8_ = 0xff800000ff800000;
                              auVar180._12_4_ = 0xff800000;
                              auVar180._16_4_ = 0xff800000;
                              auVar180._20_4_ = 0xff800000;
                              auVar180._24_4_ = 0xff800000;
                              auVar180._28_4_ = 0xff800000;
                              auVar218 = vblendvps_avx(auVar180,*(undefined1 (*) [32])
                                                                 (local_ab0.ray + 0x100),auVar218);
                              *(undefined1 (*) [32])(local_ab0.ray + 0x100) = auVar218;
                            }
                            auVar287 = ZEXT464((uint)fVar208);
                            bVar60 = (auVar237 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar61 = (auVar237 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar59 = (auVar237 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar58 = SUB321(auVar237 >> 0x7f,0) != '\0';
                            bVar57 = (auVar237 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar56 = SUB321(auVar237 >> 0xbf,0) != '\0';
                            bVar54 = (auVar237 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar53 = auVar237[0x1f] < '\0';
                            unaff_BL = ((((((bVar60 || bVar61) || bVar59) || bVar58) || bVar57) ||
                                        bVar56) || bVar54) || bVar53;
                            if (((((((!bVar60 && !bVar61) && !bVar59) && !bVar58) && !bVar57) &&
                                 !bVar56) && !bVar54) && !bVar53) {
                              *(float *)(ray + k * 4 + 0x100) = fVar208;
                            }
                            bVar53 = false;
                            goto LAB_0166c53a;
                          }
                          unaff_BL = 1;
                        }
                        bVar53 = false;
                        goto LAB_0166c53a;
                      }
                    }
                    bVar53 = false;
                    unaff_BL = 0;
                  }
                }
LAB_0166c53a:
                auVar269 = ZEXT464((uint)fVar251);
                if (!bVar53) goto LAB_0166c8a9;
                lVar93 = lVar93 + -1;
              } while (lVar93 != 0);
              unaff_BL = 0;
LAB_0166c8a9:
              unaff_BL = unaff_BL & 1;
              uVar92 = CONCAT71(local_880._1_7_,local_880[0] | unaff_BL);
              uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar124._4_4_ = uVar95;
              auVar124._0_4_ = uVar95;
              auVar124._8_4_ = uVar95;
              auVar124._12_4_ = uVar95;
              auVar124._16_4_ = uVar95;
              auVar124._20_4_ = uVar95;
              auVar124._24_4_ = uVar95;
              auVar124._28_4_ = uVar95;
              auVar237 = vcmpps_avx(_local_8a0,auVar124,2);
              auVar218 = vandps_avx(auVar237,local_720);
              auVar221 = ZEXT3264(auVar218);
              auVar237 = local_720 & auVar237;
              uVar97 = local_780;
              local_720 = auVar218;
            } while ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar237 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar237 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar237 >> 0x7f,0) != '\0') ||
                       (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar237 >> 0xbf,0) != '\0') ||
                     (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar237[0x1f] < '\0');
          }
          auVar184._0_4_ = auVar305._0_4_ * (float)local_960._0_4_;
          auVar184._4_4_ = auVar305._4_4_ * (float)local_960._4_4_;
          auVar184._8_4_ = auVar305._8_4_ * fStack_958;
          auVar184._12_4_ = auVar305._12_4_ * fStack_954;
          auVar184._16_4_ = auVar305._16_4_ * fStack_950;
          auVar184._20_4_ = auVar305._20_4_ * fStack_94c;
          auVar184._28_36_ = auVar221._28_36_;
          auVar184._24_4_ = auVar305._24_4_ * fStack_948;
          auVar9 = vfmadd132ps_fma(local_940,auVar184._0_32_,_local_8e0);
          auVar9 = vfmadd213ps_fma(_local_920,auVar278,ZEXT1632(auVar9));
          auVar70._4_4_ = uStack_8fc;
          auVar70._0_4_ = local_900;
          auVar70._8_4_ = uStack_8f8;
          auVar70._12_4_ = uStack_8f4;
          auVar70._16_4_ = uStack_8f0;
          auVar70._20_4_ = uStack_8ec;
          auVar70._24_4_ = uStack_8e8;
          auVar70._28_4_ = uStack_8e4;
          auVar218 = vandps_avx(ZEXT1632(auVar9),auVar70);
          auVar157._8_4_ = 0x3e99999a;
          auVar157._0_8_ = 0x3e99999a3e99999a;
          auVar157._12_4_ = 0x3e99999a;
          auVar157._16_4_ = 0x3e99999a;
          auVar157._20_4_ = 0x3e99999a;
          auVar157._24_4_ = 0x3e99999a;
          auVar157._28_4_ = 0x3e99999a;
          auVar218 = vcmpps_avx(auVar218,auVar157,1);
          auVar237 = vorps_avx(auVar218,local_700);
          auVar158._0_4_ = fVar130 + (float)local_6c0._0_4_;
          auVar158._4_4_ = fVar130 + (float)local_6c0._4_4_;
          auVar158._8_4_ = fVar130 + fStack_6b8;
          auVar158._12_4_ = fVar130 + fStack_6b4;
          auVar158._16_4_ = fVar130 + fStack_6b0;
          auVar158._20_4_ = fVar130 + fStack_6ac;
          auVar158._24_4_ = fVar130 + fStack_6a8;
          auVar158._28_4_ = fVar130 + fStack_6a4;
          uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar181._4_4_ = uVar95;
          auVar181._0_4_ = uVar95;
          auVar181._8_4_ = uVar95;
          auVar181._12_4_ = uVar95;
          auVar181._16_4_ = uVar95;
          auVar181._20_4_ = uVar95;
          auVar181._24_4_ = uVar95;
          auVar181._28_4_ = uVar95;
          auVar218 = vcmpps_avx(auVar158,auVar181,2);
          local_940 = vandps_avx(auVar218,local_6e0);
          auVar159._8_4_ = 3;
          auVar159._0_8_ = 0x300000003;
          auVar159._12_4_ = 3;
          auVar159._16_4_ = 3;
          auVar159._20_4_ = 3;
          auVar159._24_4_ = 3;
          auVar159._28_4_ = 3;
          auVar182._8_4_ = 2;
          auVar182._0_8_ = 0x200000002;
          auVar182._12_4_ = 2;
          auVar182._16_4_ = 2;
          auVar182._20_4_ = 2;
          auVar182._24_4_ = 2;
          auVar182._28_4_ = 2;
          auVar218 = vblendvps_avx(auVar182,auVar159,auVar237);
          _local_960 = vpcmpgtd_avx2(auVar218,local_2c0);
          auVar218 = vpandn_avx2(_local_960,local_940);
          auVar237 = local_940 & ~_local_960;
          if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar237 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar237 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar237 >> 0x7f,0) != '\0') ||
                (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar237 >> 0xbf,0) != '\0') ||
              (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar237[0x1f] < '\0') {
            auVar102 = vminps_avx(auVar10,auVar103);
            auVar9 = vmaxps_avx(auVar10,auVar103);
            auVar109 = vminps_avx(auVar7,auVar8);
            auVar137 = vminps_avx(auVar102,auVar109);
            auVar102 = vmaxps_avx(auVar7,auVar8);
            auVar109 = vmaxps_avx(auVar9,auVar102);
            auVar9 = vandps_avx(auVar137,auVar243);
            auVar102 = vandps_avx(auVar109,auVar243);
            auVar9 = vmaxps_avx(auVar9,auVar102);
            auVar102 = vmovshdup_avx(auVar9);
            auVar102 = vmaxss_avx(auVar102,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar102);
            local_9e0._0_4_ = auVar9._0_4_ * 1.9073486e-06;
            local_860 = vshufps_avx(auVar109,auVar109,0xff);
            _local_8a0 = _local_300;
            local_920._4_4_ = (float)local_300._4_4_ + fVar130;
            local_920._0_4_ = (float)local_300._0_4_ + fVar130;
            fStack_918 = fStack_2f8 + fVar130;
            fStack_914 = fStack_2f4 + fVar130;
            fStack_910 = fStack_2f0 + fVar130;
            fStack_90c = fStack_2ec + fVar130;
            fStack_908 = fStack_2e8 + fVar130;
            fStack_904 = fStack_2e4 + fVar130;
            do {
              auVar160._8_4_ = 0x7f800000;
              auVar160._0_8_ = 0x7f8000007f800000;
              auVar160._12_4_ = 0x7f800000;
              auVar160._16_4_ = 0x7f800000;
              auVar160._20_4_ = 0x7f800000;
              auVar160._24_4_ = 0x7f800000;
              auVar160._28_4_ = 0x7f800000;
              auVar237 = vblendvps_avx(auVar160,_local_8a0,auVar218);
              auVar114 = vshufps_avx(auVar237,auVar237,0xb1);
              auVar114 = vminps_avx(auVar237,auVar114);
              auVar11 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar11);
              auVar11 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar11);
              auVar114 = vcmpps_avx(auVar237,auVar114,0);
              auVar11 = auVar218 & auVar114;
              auVar237 = auVar218;
              if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar11 >> 0x7f,0) != '\0') ||
                    (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0xbf,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar11[0x1f] < '\0') {
                auVar237 = vandps_avx(auVar114,auVar218);
              }
              local_880._0_8_ = uVar92;
              uVar94 = vmovmskps_avx(auVar237);
              iVar88 = 0;
              for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
                iVar88 = iVar88 + 1;
              }
              uVar89 = iVar88 << 2;
              local_740 = auVar218;
              *(undefined4 *)(local_740 + uVar89) = 0;
              uVar94 = *(uint *)(local_680 + uVar89);
              uVar89 = *(uint *)(local_2e0 + uVar89);
              fVar288 = auVar6._0_4_;
              if ((float)local_a20._0_4_ < 0.0) {
                fVar288 = sqrtf((float)local_a20._0_4_);
              }
              auVar280 = ZEXT464(uVar89);
              auVar269 = ZEXT464(uVar94);
              local_7e0._0_4_ = fVar288 * 1.9073486e-06;
              lVar93 = 5;
              do {
                fVar223 = auVar269._0_4_;
                fVar226 = 1.0 - fVar223;
                fVar224 = fVar226 * fVar226 * fVar226;
                fVar222 = fVar223 * fVar223 * fVar223;
                auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar224),
                                           ZEXT416((uint)fVar222));
                fVar208 = fVar223 * fVar226;
                auVar109 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar208 * 6.0)),
                                           ZEXT416((uint)(fVar226 * fVar208)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar137 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * fVar208 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar223 * fVar208)));
                auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar222),
                                         ZEXT416((uint)fVar224));
                fVar288 = (auVar9._0_4_ + auVar137._0_4_) * 0.16666667;
                fVar222 = fVar222 * 0.16666667;
                auVar143._0_4_ = fVar222 * fVar188;
                auVar143._4_4_ = fVar222 * fStack_b7c;
                auVar143._8_4_ = fVar222 * fStack_b78;
                auVar143._12_4_ = fVar222 * fStack_b74;
                auVar197._4_4_ = fVar288;
                auVar197._0_4_ = fVar288;
                auVar197._8_4_ = fVar288;
                auVar197._12_4_ = fVar288;
                auVar9 = vfmadd132ps_fma(auVar197,auVar143,auVar7);
                fVar288 = (auVar102._0_4_ + auVar109._0_4_) * 0.16666667;
                auVar144._4_4_ = fVar288;
                auVar144._0_4_ = fVar288;
                auVar144._8_4_ = fVar288;
                auVar144._12_4_ = fVar288;
                auVar9 = vfmadd132ps_fma(auVar144,auVar9,auVar103);
                fVar288 = auVar280._0_4_;
                auVar169._4_4_ = fVar288;
                auVar169._0_4_ = fVar288;
                auVar169._8_4_ = fVar288;
                auVar169._12_4_ = fVar288;
                auVar102 = vfmadd213ps_fma(auVar169,local_a10,_DAT_01feba10);
                fVar224 = fVar224 * 0.16666667;
                auVar108._4_4_ = fVar224;
                auVar108._0_4_ = fVar224;
                auVar108._8_4_ = fVar224;
                auVar108._12_4_ = fVar224;
                auVar9 = vfmadd132ps_fma(auVar108,auVar9,auVar10);
                local_7c0._0_16_ = auVar9;
                auVar9 = vsubps_avx(auVar102,auVar9);
                _local_a00 = auVar9;
                auVar9 = vdpps_avx(auVar9,auVar9,0x7f);
                fVar222 = auVar9._0_4_;
                auVar102 = auVar269._0_16_;
                if (fVar222 < 0.0) {
                  auVar280._0_4_ = sqrtf(fVar222);
                  auVar280._4_60_ = extraout_var_00;
                  auVar109 = auVar280._0_16_;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar9,auVar9);
                }
                auVar189 = ZEXT416((uint)fVar226);
                auVar110._4_4_ = fVar226;
                auVar110._0_4_ = fVar226;
                auVar110._8_4_ = fVar226;
                auVar110._12_4_ = fVar226;
                auVar101 = vfnmsub213ss_fma(auVar102,auVar102,ZEXT416((uint)(fVar208 * 4.0)));
                auVar137 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * 4.0)),auVar189,auVar189);
                fVar208 = fVar226 * -fVar226 * 0.5;
                fVar224 = auVar101._0_4_ * 0.5;
                fVar226 = auVar137._0_4_ * 0.5;
                fVar251 = fVar223 * fVar223 * 0.5;
                auVar234._0_4_ = fVar188 * fVar251;
                auVar234._4_4_ = fStack_b7c * fVar251;
                auVar234._8_4_ = fStack_b78 * fVar251;
                auVar234._12_4_ = fStack_b74 * fVar251;
                auVar198._4_4_ = fVar226;
                auVar198._0_4_ = fVar226;
                auVar198._8_4_ = fVar226;
                auVar198._12_4_ = fVar226;
                auVar137 = vfmadd213ps_fma(auVar198,auVar7,auVar234);
                auVar213._4_4_ = fVar224;
                auVar213._0_4_ = fVar224;
                auVar213._8_4_ = fVar224;
                auVar213._12_4_ = fVar224;
                auVar137 = vfmadd213ps_fma(auVar213,auVar103,auVar137);
                auVar285._4_4_ = fVar208;
                auVar285._0_4_ = fVar208;
                auVar285._8_4_ = fVar208;
                auVar285._12_4_ = fVar208;
                auVar138 = vfmadd213ps_fma(auVar285,auVar10,auVar137);
                auVar137 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar189,auVar102);
                auVar102 = vfmadd231ss_fma(auVar189,auVar102,SUB6416(ZEXT464(0xc0000000),0));
                auVar199._0_4_ = fVar188 * fVar223;
                auVar199._4_4_ = fStack_b7c * fVar223;
                auVar199._8_4_ = fStack_b78 * fVar223;
                auVar199._12_4_ = fStack_b74 * fVar223;
                uVar95 = auVar102._0_4_;
                auVar214._4_4_ = uVar95;
                auVar214._0_4_ = uVar95;
                auVar214._8_4_ = uVar95;
                auVar214._12_4_ = uVar95;
                auVar102 = vfmadd213ps_fma(auVar214,auVar7,auVar199);
                auVar170._0_4_ = auVar137._0_4_;
                auVar170._4_4_ = auVar170._0_4_;
                auVar170._8_4_ = auVar170._0_4_;
                auVar170._12_4_ = auVar170._0_4_;
                auVar102 = vfmadd213ps_fma(auVar170,auVar103,auVar102);
                auVar189 = vfmadd231ps_fma(auVar102,auVar10,auVar110);
                auVar137 = vdpps_avx(auVar138,auVar138,0x7f);
                auVar102 = vblendps_avx(auVar137,_DAT_01feba10,0xe);
                auVar101 = vrsqrtss_avx(auVar102,auVar102);
                fVar208 = auVar101._0_4_;
                fVar226 = auVar137._0_4_;
                fVar208 = fVar208 * 1.5 + fVar226 * -0.5 * fVar208 * fVar208 * fVar208;
                auVar101 = vdpps_avx(auVar138,auVar189,0x7f);
                auVar171._0_4_ = auVar189._0_4_ * fVar226;
                auVar171._4_4_ = auVar189._4_4_ * fVar226;
                auVar171._8_4_ = auVar189._8_4_ * fVar226;
                auVar171._12_4_ = auVar189._12_4_ * fVar226;
                fVar224 = auVar101._0_4_;
                auVar235._0_4_ = auVar138._0_4_ * fVar224;
                auVar235._4_4_ = auVar138._4_4_ * fVar224;
                fVar251 = auVar138._8_4_;
                auVar235._8_4_ = fVar251 * fVar224;
                fVar262 = auVar138._12_4_;
                auVar235._12_4_ = fVar262 * fVar224;
                auVar101 = vsubps_avx(auVar171,auVar235);
                auVar102 = vrcpss_avx(auVar102,auVar102);
                auVar189 = vfnmadd213ss_fma(auVar102,auVar137,ZEXT416(0x40000000));
                fVar224 = auVar102._0_4_ * auVar189._0_4_;
                auVar102 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(fVar288 * (float)local_7e0._0_4_)));
                auVar221 = ZEXT1664(auVar102);
                local_a40._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
                local_a40._8_4_ = -fVar251;
                local_a40._12_4_ = -fVar262;
                auVar200._0_4_ = fVar208 * auVar101._0_4_ * fVar224;
                auVar200._4_4_ = fVar208 * auVar101._4_4_ * fVar224;
                auVar200._8_4_ = fVar208 * auVar101._8_4_ * fVar224;
                auVar200._12_4_ = fVar208 * auVar101._12_4_ * fVar224;
                auVar245._0_4_ = auVar138._0_4_ * fVar208;
                auVar245._4_4_ = auVar138._4_4_ * fVar208;
                auVar245._8_4_ = fVar251 * fVar208;
                auVar245._12_4_ = fVar262 * fVar208;
                if (fVar226 < -fVar226) {
                  local_a80._0_16_ = auVar200;
                  fVar208 = sqrtf(fVar226);
                  auVar221 = ZEXT464(auVar102._0_4_);
                  auVar109 = ZEXT416(auVar109._0_4_);
                  auVar200 = local_a80._0_16_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar137,auVar137);
                  fVar208 = auVar137._0_4_;
                }
                auVar137 = vdpps_avx(_local_a00,auVar245,0x7f);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)local_9e0._0_4_),auVar109,auVar221._0_16_);
                auVar101 = vdpps_avx(local_a40._0_16_,auVar245,0x7f);
                auVar189 = vdpps_avx(_local_a00,auVar200,0x7f);
                auVar145 = vdpps_avx(local_a10,auVar245,0x7f);
                auVar100 = vfmadd213ss_fma(ZEXT416((uint)(auVar109._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_9e0._0_4_ / fVar208)),
                                           auVar100);
                auVar296 = ZEXT1664(auVar100);
                fVar208 = auVar101._0_4_ + auVar189._0_4_;
                auVar111._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                auVar111._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                auVar111._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                auVar111._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                auVar109 = vdpps_avx(_local_a00,local_a40._0_16_,0x7f);
                auVar189 = vsubps_avx(auVar9,auVar111);
                auVar101 = vrsqrtss_avx(auVar189,auVar189);
                fVar226 = auVar189._0_4_;
                fVar224 = auVar101._0_4_;
                fVar224 = fVar224 * 1.5 + fVar226 * -0.5 * fVar224 * fVar224 * fVar224;
                auVar101 = vdpps_avx(_local_a00,local_a10,0x7f);
                local_a40._0_16_ = vfnmadd231ss_fma(auVar109,auVar137,ZEXT416((uint)fVar208));
                auVar109 = vfnmadd231ss_fma(auVar101,auVar137,auVar145);
                if (fVar226 < 0.0) {
                  local_a80._0_4_ = auVar100._0_4_;
                  local_800._0_16_ = ZEXT416((uint)fVar208);
                  local_820._0_4_ = fVar224;
                  local_840._0_16_ = auVar109;
                  fVar226 = sqrtf(fVar226);
                  auVar296 = ZEXT464((uint)local_a80._0_4_);
                  auVar221 = ZEXT464(auVar102._0_4_);
                  fVar224 = (float)local_820._0_4_;
                  auVar109 = local_840._0_16_;
                  auVar102 = local_800._0_16_;
                }
                else {
                  auVar102 = vsqrtss_avx(auVar189,auVar189);
                  fVar226 = auVar102._0_4_;
                  auVar102 = ZEXT416((uint)fVar208);
                }
                auVar287 = ZEXT1664(auVar137);
                auVar250 = ZEXT1664(auVar138);
                auVar101 = vpermilps_avx(local_7c0._0_16_,0xff);
                auVar189 = vshufps_avx(auVar138,auVar138,0xff);
                auVar100 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar224),auVar189);
                auVar201._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar201._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar201._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar215._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar215._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar215._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar109 = ZEXT416((uint)(auVar109._0_4_ * fVar224));
                auVar145 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * auVar145._0_4_)),auVar102
                                           ,auVar109);
                auVar109 = vinsertps_avx(auVar109,auVar201,0x10);
                uVar95 = auVar145._0_4_;
                auVar202._4_4_ = uVar95;
                auVar202._0_4_ = uVar95;
                auVar202._8_4_ = uVar95;
                auVar202._12_4_ = uVar95;
                auVar109 = vdivps_avx(auVar109,auVar202);
                auVar145 = ZEXT416((uint)(fVar226 - auVar101._0_4_));
                auVar101 = vinsertps_avx(auVar137,auVar145,0x10);
                auVar172._0_4_ = auVar101._0_4_ * auVar109._0_4_;
                auVar172._4_4_ = auVar101._4_4_ * auVar109._4_4_;
                auVar172._8_4_ = auVar101._8_4_ * auVar109._8_4_;
                auVar172._12_4_ = auVar101._12_4_ * auVar109._12_4_;
                auVar102 = vinsertps_avx(auVar215,auVar102,0x1c);
                auVar102 = vdivps_avx(auVar102,auVar202);
                auVar109 = vhaddps_avx(auVar172,auVar172);
                auVar203._0_4_ = auVar101._0_4_ * auVar102._0_4_;
                auVar203._4_4_ = auVar101._4_4_ * auVar102._4_4_;
                auVar203._8_4_ = auVar101._8_4_ * auVar102._8_4_;
                auVar203._12_4_ = auVar101._12_4_ * auVar102._12_4_;
                auVar102 = vhaddps_avx(auVar203,auVar203);
                fVar223 = fVar223 - auVar109._0_4_;
                fVar288 = fVar288 - auVar102._0_4_;
                auVar280 = ZEXT464((uint)fVar288);
                auVar102 = vandps_avx(auVar137,auVar243);
                bVar53 = true;
                if (auVar102._0_4_ < auVar296._0_4_) {
                  auVar109 = vfmadd231ss_fma(ZEXT416((uint)(auVar221._0_4_ + auVar296._0_4_)),
                                             local_860,ZEXT416(0x36000000));
                  auVar102 = vandps_avx(auVar145,auVar243);
                  auVar218 = SUB6432(ZEXT864(0),0) << 0x20;
                  if (auVar102._0_4_ < auVar109._0_4_) {
                    fVar288 = fVar288 + (float)local_9a0._0_4_;
                    auVar280 = ZEXT464((uint)fVar288);
                    if (fVar128 <= fVar288) {
                      fVar208 = *(float *)(ray + k * 4 + 0x100);
                      auVar287 = ZEXT464((uint)fVar208);
                      if (((fVar288 <= fVar208) && (0.0 <= fVar223)) && (fVar223 <= 1.0)) {
                        auVar9 = vrsqrtss_avx(auVar9,auVar9);
                        fVar224 = auVar9._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar91].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            unaff_BL = true;
                          }
                          else {
                            fVar222 = fVar224 * 1.5 + fVar222 * -0.5 * fVar224 * fVar224 * fVar224;
                            auVar146._0_4_ = fVar222 * (float)local_a00._0_4_;
                            auVar146._4_4_ = fVar222 * (float)local_a00._4_4_;
                            auVar146._8_4_ = fVar222 * fStack_9f8;
                            auVar146._12_4_ = fVar222 * fStack_9f4;
                            auVar137 = vfmadd213ps_fma(auVar189,auVar146,auVar138);
                            auVar9 = vshufps_avx(auVar146,auVar146,0xc9);
                            auVar102 = vshufps_avx(auVar138,auVar138,0xc9);
                            auVar147._0_4_ = auVar146._0_4_ * auVar102._0_4_;
                            auVar147._4_4_ = auVar146._4_4_ * auVar102._4_4_;
                            auVar147._8_4_ = auVar146._8_4_ * auVar102._8_4_;
                            auVar147._12_4_ = auVar146._12_4_ * auVar102._12_4_;
                            auVar109 = vfmsub231ps_fma(auVar147,auVar138,auVar9);
                            auVar9 = vshufps_avx(auVar109,auVar109,0xc9);
                            auVar102 = vshufps_avx(auVar137,auVar137,0xc9);
                            auVar109 = vshufps_avx(auVar109,auVar109,0xd2);
                            auVar112._0_4_ = auVar137._0_4_ * auVar109._0_4_;
                            auVar112._4_4_ = auVar137._4_4_ * auVar109._4_4_;
                            auVar112._8_4_ = auVar137._8_4_ * auVar109._8_4_;
                            auVar112._12_4_ = auVar137._12_4_ * auVar109._12_4_;
                            auVar102 = vfmsub231ps_fma(auVar112,auVar9,auVar102);
                            auVar161._4_4_ = fVar223;
                            auVar161._0_4_ = fVar223;
                            auVar161._8_4_ = fVar223;
                            auVar161._12_4_ = fVar223;
                            auVar161._16_4_ = fVar223;
                            auVar161._20_4_ = fVar223;
                            auVar161._24_4_ = fVar223;
                            auVar161._28_4_ = fVar223;
                            auVar9 = vmovshdup_avx(auVar102);
                            local_420._8_8_ = auVar9._0_8_;
                            auVar9 = vshufps_avx(auVar102,auVar102,0xaa);
                            local_400 = auVar9._0_8_;
                            local_3e0 = auVar102._0_4_;
                            local_420._0_8_ = local_420._8_8_;
                            local_420._16_8_ = local_420._8_8_;
                            local_420._24_8_ = local_420._8_8_;
                            uStack_3f8 = local_400;
                            uStack_3f0 = local_400;
                            uStack_3e8 = local_400;
                            uStack_3dc = local_3e0;
                            uStack_3d8 = local_3e0;
                            uStack_3d4 = local_3e0;
                            uStack_3d0 = local_3e0;
                            uStack_3cc = local_3e0;
                            uStack_3c8 = local_3e0;
                            uStack_3c4 = local_3e0;
                            local_3c0 = auVar161;
                            local_3a0 = ZEXT832(0) << 0x20;
                            local_380 = CONCAT44(uStack_5fc,local_600);
                            uStack_378 = CONCAT44(uStack_5f4,uStack_5f8);
                            uStack_370 = CONCAT44(uStack_5ec,uStack_5f0);
                            uStack_368 = CONCAT44(uStack_5e4,uStack_5e8);
                            local_360._4_4_ = uStack_5dc;
                            local_360._0_4_ = local_5e0;
                            local_360._8_4_ = uStack_5d8;
                            local_360._12_4_ = uStack_5d4;
                            local_360._16_4_ = uStack_5d0;
                            local_360._20_4_ = uStack_5cc;
                            local_360._24_4_ = uStack_5c8;
                            local_360._28_4_ = uStack_5c4;
                            vpcmpeqd_avx2(local_360,local_360);
                            local_340 = context->user->instID[0];
                            uStack_33c = local_340;
                            uStack_338 = local_340;
                            uStack_334 = local_340;
                            uStack_330 = local_340;
                            uStack_32c = local_340;
                            uStack_328 = local_340;
                            uStack_324 = local_340;
                            local_320 = context->user->instPrimID[0];
                            uStack_31c = local_320;
                            uStack_318 = local_320;
                            uStack_314 = local_320;
                            uStack_310 = local_320;
                            uStack_30c = local_320;
                            uStack_308 = local_320;
                            uStack_304 = local_320;
                            *(float *)(ray + k * 4 + 0x100) = fVar288;
                            local_9c0 = local_620._0_8_;
                            uStack_9b8 = local_620._8_8_;
                            uStack_9b0 = local_620._16_8_;
                            uStack_9a8 = local_620._24_8_;
                            local_ab0.valid = (int *)&local_9c0;
                            local_ab0.geometryUserPtr = pGVar3->userPtr;
                            local_ab0.context = context->user;
                            local_ab0.hit = (RTCHitN *)local_420;
                            local_ab0.N = 8;
                            local_ab0.ray = (RTCRayN *)ray;
                            if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar250 = ZEXT1664(auVar138);
                              auVar296 = ZEXT1664(auVar296._0_16_);
                              (*pGVar3->occlusionFilterN)(&local_ab0);
                              auVar287._8_56_ = extraout_var_03;
                              auVar287._0_8_ = extraout_XMM1_Qa_00;
                              auVar161 = auVar287._0_32_;
                              auVar218 = ZEXT1632(ZEXT816(0) << 0x40);
                            }
                            auVar64._8_8_ = uStack_9b8;
                            auVar64._0_8_ = local_9c0;
                            auVar64._16_8_ = uStack_9b0;
                            auVar64._24_8_ = uStack_9a8;
                            auVar114 = vpcmpeqd_avx2(auVar218,auVar64);
                            auVar11 = vpcmpeqd_avx2(auVar161,auVar161);
                            auVar237 = auVar11 & ~auVar114;
                            if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar237 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar237 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar237 >> 0x7f,0) == '\0') &&
                                  (auVar237 & (undefined1  [32])0x100000000) ==
                                  (undefined1  [32])0x0) && SUB321(auVar237 >> 0xbf,0) == '\0') &&
                                (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar237[0x1f]) {
                              auVar114 = auVar114 ^ auVar11;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar250 = ZEXT1664(auVar250._0_16_);
                                auVar296 = ZEXT1664(auVar296._0_16_);
                                auVar127._0_8_ = (*p_Var4)(&local_ab0);
                                auVar127._8_56_ = extraout_var_01;
                                auVar114 = auVar127._0_32_;
                                auVar218 = ZEXT1632(ZEXT816(0) << 0x40);
                              }
                              auVar65._8_8_ = uStack_9b8;
                              auVar65._0_8_ = local_9c0;
                              auVar65._16_8_ = uStack_9b0;
                              auVar65._24_8_ = uStack_9a8;
                              auVar218 = vpcmpeqd_avx2(auVar218,auVar65);
                              auVar114 = vpcmpeqd_avx2(auVar114,auVar114);
                              auVar114 = auVar218 ^ auVar114;
                              auVar183._8_4_ = 0xff800000;
                              auVar183._0_8_ = 0xff800000ff800000;
                              auVar183._12_4_ = 0xff800000;
                              auVar183._16_4_ = 0xff800000;
                              auVar183._20_4_ = 0xff800000;
                              auVar183._24_4_ = 0xff800000;
                              auVar183._28_4_ = 0xff800000;
                              auVar218 = vblendvps_avx(auVar183,*(undefined1 (*) [32])
                                                                 (local_ab0.ray + 0x100),auVar218);
                              *(undefined1 (*) [32])(local_ab0.ray + 0x100) = auVar218;
                            }
                            bVar60 = (auVar114 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar61 = (auVar114 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar59 = (auVar114 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar58 = SUB321(auVar114 >> 0x7f,0) != '\0';
                            bVar57 = (auVar114 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar56 = SUB321(auVar114 >> 0xbf,0) != '\0';
                            bVar54 = (auVar114 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar53 = auVar114[0x1f] < '\0';
                            unaff_BL = ((((((bVar60 || bVar61) || bVar59) || bVar58) || bVar57) ||
                                        bVar56) || bVar54) || bVar53;
                            if (((((((!bVar60 && !bVar61) && !bVar59) && !bVar58) && !bVar57) &&
                                 !bVar56) && !bVar54) && !bVar53) {
                              *(float *)(ray + k * 4 + 0x100) = fVar208;
                            }
                          }
                          auVar280 = ZEXT464((uint)fVar288);
                          auVar287 = ZEXT464((uint)fVar208);
                          bVar53 = false;
                          goto LAB_0166d08c;
                        }
                      }
                    }
                    bVar53 = false;
                    unaff_BL = 0;
                  }
                }
LAB_0166d08c:
                auVar269 = ZEXT464((uint)fVar223);
                if (!bVar53) goto LAB_0166d399;
                lVar93 = lVar93 + -1;
              } while (lVar93 != 0);
              unaff_BL = 0;
LAB_0166d399:
              unaff_BL = unaff_BL & 1;
              uVar92 = CONCAT71(local_880._1_7_,local_880[0] | unaff_BL);
              uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar125._4_4_ = uVar95;
              auVar125._0_4_ = uVar95;
              auVar125._8_4_ = uVar95;
              auVar125._12_4_ = uVar95;
              auVar125._16_4_ = uVar95;
              auVar125._20_4_ = uVar95;
              auVar125._24_4_ = uVar95;
              auVar125._28_4_ = uVar95;
              auVar237 = vcmpps_avx(_local_920,auVar125,2);
              auVar218 = vandps_avx(auVar237,local_740);
              local_740 = local_740 & auVar237;
              uVar97 = local_780;
            } while ((((((((local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_740 >> 0x7f,0) != '\0') ||
                       (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_740 >> 0xbf,0) != '\0') ||
                     (local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_740[0x1f] < '\0');
          }
          auVar162._0_4_ = fVar130 + local_460._0_4_;
          auVar162._4_4_ = fVar130 + local_460._4_4_;
          auVar162._8_4_ = fVar130 + local_460._8_4_;
          auVar162._12_4_ = fVar130 + local_460._12_4_;
          auVar162._16_4_ = fVar130 + local_460._16_4_;
          auVar162._20_4_ = fVar130 + local_460._20_4_;
          auVar162._24_4_ = fVar130 + local_460._24_4_;
          auVar162._28_4_ = fVar130 + local_460._28_4_;
          uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar207._4_4_ = uVar95;
          auVar207._0_4_ = uVar95;
          auVar207._8_4_ = uVar95;
          auVar207._12_4_ = uVar95;
          auVar207._16_4_ = uVar95;
          auVar207._20_4_ = uVar95;
          auVar207._24_4_ = uVar95;
          auVar207._28_4_ = uVar95;
          auVar237 = vcmpps_avx(auVar162,auVar207,2);
          auVar218 = vandps_avx(local_6a0,local_7a0);
          auVar218 = vandps_avx(auVar237,auVar218);
          auVar219._0_4_ = fVar130 + local_300._0_4_;
          auVar219._4_4_ = fVar130 + local_300._4_4_;
          auVar219._8_4_ = fVar130 + local_300._8_4_;
          auVar219._12_4_ = fVar130 + local_300._12_4_;
          auVar219._16_4_ = fVar130 + local_300._16_4_;
          auVar219._20_4_ = fVar130 + local_300._20_4_;
          auVar219._24_4_ = fVar130 + local_300._24_4_;
          auVar219._28_4_ = fVar130 + local_300._28_4_;
          auVar114 = vcmpps_avx(auVar219,auVar207,2);
          auVar237 = vandps_avx(_local_960,local_940);
          auVar221 = ZEXT3264(auVar237);
          auVar237 = vandps_avx(auVar114,auVar237);
          auVar237 = vorps_avx(auVar218,auVar237);
          if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar237 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar237 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar237 >> 0x7f,0) != '\0') ||
                (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar237 >> 0xbf,0) != '\0') ||
              (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar237[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar96 * 0x60) = auVar237;
            auVar218 = vblendvps_avx(_local_300,local_460,auVar218);
            *(undefined1 (*) [32])(auStack_160 + uVar96 * 0x60) = auVar218;
            uVar1 = vmovlps_avx(local_990);
            *(undefined8 *)(afStack_140 + uVar96 * 0x18) = uVar1;
            auStack_138[uVar96 * 0x18] = (int)uVar97 + 1;
            uVar96 = (ulong)((int)uVar96 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar96 == 0) {
        if ((uVar92 & 1) != 0) {
          return local_c89;
        }
        uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar113._4_4_ = uVar95;
        auVar113._0_4_ = uVar95;
        auVar113._8_4_ = uVar95;
        auVar113._12_4_ = uVar95;
        auVar5 = vcmpps_avx(local_630,auVar113,2);
        uVar91 = vmovmskps_avx(auVar5);
        uVar91 = (uint)local_968 & uVar91;
        local_c89 = uVar91 != 0;
        if (!local_c89) {
          return local_c89;
        }
        goto LAB_0166ad63;
      }
      uVar90 = (ulong)((int)uVar96 - 1);
      lVar93 = uVar90 * 0x60;
      auVar218 = *(undefined1 (*) [32])(auStack_160 + lVar93);
      auVar122._0_4_ = fVar130 + auVar218._0_4_;
      auVar122._4_4_ = fVar130 + auVar218._4_4_;
      auVar122._8_4_ = fVar130 + auVar218._8_4_;
      auVar122._12_4_ = fVar130 + auVar218._12_4_;
      auVar122._16_4_ = fVar130 + auVar218._16_4_;
      auVar122._20_4_ = fVar130 + auVar218._20_4_;
      auVar122._24_4_ = fVar130 + auVar218._24_4_;
      auVar122._28_4_ = fVar130 + auVar218._28_4_;
      uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar206._4_4_ = uVar95;
      auVar206._0_4_ = uVar95;
      auVar206._8_4_ = uVar95;
      auVar206._12_4_ = uVar95;
      auVar206._16_4_ = uVar95;
      auVar206._20_4_ = uVar95;
      auVar206._24_4_ = uVar95;
      auVar206._28_4_ = uVar95;
      auVar114 = vcmpps_avx(auVar122,auVar206,2);
      auVar237 = vandps_avx(auVar114,*(undefined1 (*) [32])(auStack_180 + lVar93));
      local_420 = auVar237;
      auVar114 = *(undefined1 (*) [32])(auStack_180 + lVar93) & auVar114;
      bVar60 = (auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar61 = (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar59 = (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar58 = SUB321(auVar114 >> 0x7f,0) == '\0';
      bVar57 = (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar56 = SUB321(auVar114 >> 0xbf,0) == '\0';
      bVar54 = (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar53 = -1 < auVar114[0x1f];
      if (((((((!bVar60 || !bVar61) || !bVar59) || !bVar58) || !bVar57) || !bVar56) || !bVar54) ||
          !bVar53) {
        auVar178._8_4_ = 0x7f800000;
        auVar178._0_8_ = 0x7f8000007f800000;
        auVar178._12_4_ = 0x7f800000;
        auVar178._16_4_ = 0x7f800000;
        auVar178._20_4_ = 0x7f800000;
        auVar178._24_4_ = 0x7f800000;
        auVar178._28_4_ = 0x7f800000;
        auVar218 = vblendvps_avx(auVar178,auVar218,auVar237);
        auVar114 = vshufps_avx(auVar218,auVar218,0xb1);
        auVar114 = vminps_avx(auVar218,auVar114);
        auVar11 = vshufpd_avx(auVar114,auVar114,5);
        auVar114 = vminps_avx(auVar114,auVar11);
        auVar11 = vpermpd_avx2(auVar114,0x4e);
        auVar114 = vminps_avx(auVar114,auVar11);
        auVar218 = vcmpps_avx(auVar218,auVar114,0);
        auVar114 = auVar237 & auVar218;
        if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar114 >> 0x7f,0) != '\0') ||
              (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0xbf,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar114[0x1f] < '\0') {
          auVar237 = vandps_avx(auVar218,auVar237);
        }
        fVar288 = afStack_140[uVar90 * 0x18 + 1];
        uVar97 = (ulong)auStack_138[uVar90 * 0x18];
        uVar94 = vmovmskps_avx(auVar237);
        iVar88 = 0;
        for (; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x80000000) {
          iVar88 = iVar88 + 1;
        }
        fVar208 = afStack_140[uVar90 * 0x18];
        auVar123._4_4_ = fVar208;
        auVar123._0_4_ = fVar208;
        auVar123._8_4_ = fVar208;
        auVar123._12_4_ = fVar208;
        auVar123._16_4_ = fVar208;
        auVar123._20_4_ = fVar208;
        auVar123._24_4_ = fVar208;
        auVar123._28_4_ = fVar208;
        *(undefined4 *)(local_420 + (uint)(iVar88 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar93) = local_420;
        if ((((((((local_420 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_420 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_420 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_420 >> 0x7f,0) != '\0') ||
              (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_420 >> 0xbf,0) != '\0') ||
            (local_420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_420[0x1f] < '\0') {
          uVar90 = uVar96;
        }
        fVar288 = fVar288 - fVar208;
        auVar152._4_4_ = fVar288;
        auVar152._0_4_ = fVar288;
        auVar152._8_4_ = fVar288;
        auVar152._12_4_ = fVar288;
        auVar152._16_4_ = fVar288;
        auVar152._20_4_ = fVar288;
        auVar152._24_4_ = fVar288;
        auVar152._28_4_ = fVar288;
        auVar9 = vfmadd132ps_fma(auVar152,auVar123,_DAT_02020f20);
        local_460 = ZEXT1632(auVar9);
        local_990._8_8_ = 0;
        local_990._0_8_ = *(ulong *)(local_460 + (uint)(iVar88 << 2));
      }
      uVar96 = uVar90;
      fVar288 = fVar130;
    } while (((((((bVar60 && bVar61) && bVar59) && bVar58) && bVar57) && bVar56) && bVar54) &&
             bVar53);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }